

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_avx::forward
          (InnerProduct_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  uint uVar8;
  _func_int *p_Var9;
  int *piVar10;
  long lVar11;
  void *pvVar12;
  size_t sVar13;
  void *pvVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  ulong uVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  float *pfVar29;
  ulong uVar30;
  float *pfVar31;
  long lVar32;
  float *pfVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  float *pfVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  undefined1 auVar46 [28];
  undefined1 auVar45 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  float fVar63;
  float fVar103;
  float fVar104;
  __m128 pos;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [64];
  float fVar110;
  __m128 pos_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar158;
  float fVar162;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar156;
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 in_ZMM2 [64];
  undefined1 auVar155 [64];
  float fVar163;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  float fVar207;
  undefined1 auVar208 [16];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar209 [32];
  float fVar217;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  float fVar233;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar237 [64];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar252 [16];
  float in_register_000014dc;
  undefined1 auVar253 [32];
  float fVar254;
  undefined1 auVar255 [16];
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  undefined1 auVar256 [64];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  float fVar268;
  undefined1 auVar269 [16];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar270 [64];
  long local_158;
  int local_148;
  long local_118;
  float *local_e8;
  int *piStack_e0;
  size_t local_d8;
  int local_d0;
  Allocator *local_c8;
  int local_c0;
  int local_bc;
  undefined8 local_b8;
  int local_b0;
  size_t local_a8;
  long local_98;
  ulong local_90;
  long local_88;
  long local_80;
  Option opt_flatten;
  undefined1 auVar88 [32];
  undefined1 auVar101 [32];
  undefined1 auVar145 [32];
  undefined1 auVar150 [32];
  
  if ((opt->use_int8_inference == true) &&
     (*(int *)(&this->field_0xdc + (long)this->_vptr_InnerProduct_x86_avx[-3]) != 0)) {
    iVar26 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar26;
  }
  iVar26 = cpu_support_x86_f16c();
  if ((iVar26 != 0) && (opt->use_fp16_storage == true)) {
    iVar26 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar26;
  }
  local_c0 = bottom_blob->dims;
  if (local_c0 == 2) {
    local_bc = bottom_blob->w;
    if (local_bc ==
        *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_avx[-3]) /
        *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3])) {
      Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]),
                  bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      p_Var9 = this->_vptr_InnerProduct_x86_avx[-3];
      innerproduct_gemm_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 (Mat *)(&this->field_0x178 + (long)p_Var9),
                 *(int *)(&this->field_0xe0 + (long)p_Var9),
                 (Mat *)(&this->field_0xe8 + (long)p_Var9),opt);
      return 0;
    }
  }
  else {
    local_bc = bottom_blob->w;
  }
  piVar10 = bottom_blob->refcount;
  local_e8 = (float *)bottom_blob->data;
  piStack_e0 = bottom_blob->refcount;
  local_d8 = bottom_blob->elemsize;
  local_d0 = bottom_blob->elempack;
  local_c8 = bottom_blob->allocator;
  local_b8._0_4_ = bottom_blob->h;
  local_b8._4_4_ = bottom_blob->d;
  local_b0 = bottom_blob->c;
  local_a8 = bottom_blob->cstep;
  iVar26 = local_c0;
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + 1;
    UNLOCK();
    iVar26 = bottom_blob->dims;
  }
  if (iVar26 != 1) {
    opt_flatten.lightmode = opt->lightmode;
    opt_flatten._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_flatten.num_threads = opt->num_threads;
    opt_flatten.workspace_allocator = opt->workspace_allocator;
    opt_flatten.openmp_blocktime = opt->openmp_blocktime;
    opt_flatten.use_winograd_convolution = opt->use_winograd_convolution;
    opt_flatten.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_flatten.use_int8_inference = opt->use_int8_inference;
    opt_flatten.use_vulkan_compute = opt->use_vulkan_compute;
    opt_flatten.use_bf16_storage = opt->use_bf16_storage;
    opt_flatten.use_fp16_packed = opt->use_fp16_packed;
    opt_flatten.use_fp16_storage = opt->use_fp16_storage;
    opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_flatten.use_int8_packed = opt->use_int8_packed;
    opt_flatten.use_int8_storage = opt->use_int8_storage;
    opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_flatten.use_packing_layout = opt->use_packing_layout;
    opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
    opt_flatten.use_subgroup_basic = opt->use_subgroup_basic;
    opt_flatten.use_subgroup_vote = opt->use_subgroup_vote;
    opt_flatten.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_flatten.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_flatten.use_image_storage = opt->use_image_storage;
    opt_flatten.use_tensor_storage = opt->use_tensor_storage;
    opt_flatten.use_reserved_0 = opt->use_reserved_0;
    opt_flatten.flush_denormals = opt->flush_denormals;
    opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
    opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_flatten.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_flatten.use_reserved_7 = opt->use_reserved_7;
    opt_flatten.use_reserved_8 = opt->use_reserved_8;
    opt_flatten.use_reserved_9 = opt->use_reserved_9;
    opt_flatten.use_reserved_10 = opt->use_reserved_10;
    opt_flatten.use_reserved_11 = opt->use_reserved_11;
    opt_flatten.blob_allocator = opt->workspace_allocator;
    in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
    in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
    in_register_000014dc = 0.0;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_e8);
  }
  uVar8 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]);
  if (opt->use_packing_layout == true) {
    uVar27 = 8;
    if ((uVar8 & 7) != 0) {
      uVar27 = (uint)((uVar8 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar27 = 1;
  }
  Mat::create(top_blob,(int)uVar8 / (int)uVar27,(ulong)uVar27 * (local_d8 / (ulong)(long)local_d0),
              uVar27,opt->blob_allocator);
  pfVar41 = local_e8;
  local_148 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    p_Var9 = this->_vptr_InnerProduct_x86_avx[-3];
    iVar26 = *(int *)(&this->field_0xe0 + (long)p_Var9);
    iVar35 = local_d0 * local_bc;
    iVar38 = top_blob->elempack;
    uVar8 = top_blob->w;
    lVar11 = *(long *)(&this->field_0x178 + (long)p_Var9);
    if (iVar38 == 1) {
      uVar30 = 0;
      local_90 = (ulong)(uint)((int)uVar8 >> 3);
      if ((int)uVar8 >> 3 < 1) {
        local_90 = uVar30;
      }
      lVar37 = (long)iVar35;
      local_98 = lVar37 * 0x20;
      lVar34 = lVar37 * 8;
      lVar39 = lVar37 * 0xc;
      lVar44 = lVar37 << 4;
      lVar40 = lVar37 * 0x14;
      local_118 = lVar37 * 0x18;
      local_158 = lVar37 * 0x1c;
      auVar266 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar206 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar267 = ZEXT864(0);
      lVar36 = lVar37 * 4;
      for (uVar28 = 0; lVar32 = lVar36, uVar28 != local_90; uVar28 = uVar28 + 1) {
        local_88 = uVar28 * 8;
        auVar270 = ZEXT1664(ZEXT816(0) << 0x40);
        fVar254 = 0.0;
        fVar257 = 0.0;
        fVar211 = 0.0;
        fVar212 = 0.0;
        fVar258 = 0.0;
        fVar259 = 0.0;
        fVar260 = 0.0;
        fVar261 = 0.0;
        if (lVar11 != 0) {
          pfVar31 = (float *)(lVar11 + uVar28 * 0x20);
          fVar211 = *pfVar31;
          fVar212 = pfVar31[1];
          fVar254 = pfVar31[2];
          fVar257 = pfVar31[3];
          fVar258 = pfVar31[4];
          fVar259 = pfVar31[5];
          fVar260 = pfVar31[6];
          fVar261 = pfVar31[7];
        }
        pvVar12 = (this->weight_data_tm).data;
        lVar36 = 0;
        lVar42 = 0;
        auVar62 = ZEXT864(0);
        auVar256 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar102 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar155 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar180 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar225 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
        iVar38 = 0;
        while( true ) {
          if (iVar35 <= iVar38 + 7) break;
          pfVar33 = (float *)((long)local_e8 + lVar42);
          fVar262 = *pfVar33;
          fVar263 = pfVar33[1];
          fVar207 = pfVar33[2];
          fVar210 = pfVar33[3];
          fVar213 = pfVar33[4];
          fVar214 = pfVar33[5];
          fVar215 = pfVar33[6];
          pfVar31 = (float *)((long)pvVar12 + lVar42 + uVar30);
          fVar216 = in_ZMM10._28_4_;
          auVar237 = ZEXT3264(CONCAT428(fVar216 + auVar237._28_4_,
                                        CONCAT424(fVar215 * pfVar31[6] + auVar237._24_4_,
                                                  CONCAT420(fVar214 * pfVar31[5] + auVar237._20_4_,
                                                            CONCAT416(fVar213 * pfVar31[4] +
                                                                      auVar237._16_4_,
                                                                      CONCAT412(fVar210 * pfVar31[3]
                                                                                + auVar237._12_4_,
                                                                                CONCAT48(fVar207 * 
                                                  pfVar31[2] + auVar237._8_4_,
                                                  CONCAT44(fVar263 * pfVar31[1] + auVar237._4_4_,
                                                           fVar262 * *pfVar31 + auVar237._0_4_))))))
                                       ));
          pfVar31 = (float *)((long)pvVar12 + lVar42 + lVar32);
          pfVar29 = (float *)((long)pvVar12 + lVar42 + lVar34);
          auVar225 = ZEXT3264(CONCAT428(fVar216 + auVar225._28_4_,
                                        CONCAT424(fVar215 * pfVar31[6] + auVar225._24_4_,
                                                  CONCAT420(fVar214 * pfVar31[5] + auVar225._20_4_,
                                                            CONCAT416(fVar213 * pfVar31[4] +
                                                                      auVar225._16_4_,
                                                                      CONCAT412(fVar210 * pfVar31[3]
                                                                                + auVar225._12_4_,
                                                                                CONCAT48(fVar207 * 
                                                  pfVar31[2] + auVar225._8_4_,
                                                  CONCAT44(fVar263 * pfVar31[1] + auVar225._4_4_,
                                                           fVar262 * *pfVar31 + auVar225._0_4_))))))
                                       ));
          auVar180 = ZEXT3264(CONCAT428(in_register_000014dc + auVar180._28_4_,
                                        CONCAT424(fVar215 * pfVar29[6] + auVar180._24_4_,
                                                  CONCAT420(fVar214 * pfVar29[5] + auVar180._20_4_,
                                                            CONCAT416(fVar213 * pfVar29[4] +
                                                                      auVar180._16_4_,
                                                                      CONCAT412(fVar210 * pfVar29[3]
                                                                                + auVar180._12_4_,
                                                                                CONCAT48(fVar207 * 
                                                  pfVar29[2] + auVar180._8_4_,
                                                  CONCAT44(fVar263 * pfVar29[1] + auVar180._4_4_,
                                                           fVar262 * *pfVar29 + auVar180._0_4_))))))
                                       ));
          pfVar31 = (float *)((long)pvVar12 + lVar42 + lVar39);
          auVar155 = ZEXT3264(CONCAT428(fVar216 + auVar155._28_4_,
                                        CONCAT424(fVar215 * pfVar31[6] + auVar155._24_4_,
                                                  CONCAT420(fVar214 * pfVar31[5] + auVar155._20_4_,
                                                            CONCAT416(fVar213 * pfVar31[4] +
                                                                      auVar155._16_4_,
                                                                      CONCAT412(fVar210 * pfVar31[3]
                                                                                + auVar155._12_4_,
                                                                                CONCAT48(fVar207 * 
                                                  pfVar31[2] + auVar155._8_4_,
                                                  CONCAT44(fVar263 * pfVar31[1] + auVar155._4_4_,
                                                           fVar262 * *pfVar31 + auVar155._0_4_))))))
                                       ));
          pfVar31 = (float *)((long)pvVar12 + lVar42 + lVar44);
          auVar102 = ZEXT3264(CONCAT428(fVar216 + auVar102._28_4_,
                                        CONCAT424(fVar215 * pfVar31[6] + auVar102._24_4_,
                                                  CONCAT420(fVar214 * pfVar31[5] + auVar102._20_4_,
                                                            CONCAT416(fVar213 * pfVar31[4] +
                                                                      auVar102._16_4_,
                                                                      CONCAT412(fVar210 * pfVar31[3]
                                                                                + auVar102._12_4_,
                                                                                CONCAT48(fVar207 * 
                                                  pfVar31[2] + auVar102._8_4_,
                                                  CONCAT44(fVar263 * pfVar31[1] + auVar102._4_4_,
                                                           fVar262 * *pfVar31 + auVar102._0_4_))))))
                                       ));
          pfVar31 = (float *)((long)pvVar12 + lVar42 + lVar40);
          in_ZMM10 = ZEXT3264(CONCAT428(fVar216,CONCAT424(fVar215 * pfVar31[6],
                                                          CONCAT420(fVar214 * pfVar31[5],
                                                                    CONCAT416(fVar213 * pfVar31[4],
                                                                              CONCAT412(fVar210 * 
                                                  pfVar31[3],
                                                  CONCAT48(fVar207 * pfVar31[2],
                                                           CONCAT44(fVar263 * pfVar31[1],
                                                                    fVar262 * *pfVar31))))))));
          pfVar29 = (float *)((long)pvVar12 + lVar42 + local_118);
          auVar256 = ZEXT3264(CONCAT428(fVar216 + auVar256._28_4_,
                                        CONCAT424(fVar215 * pfVar31[6] + auVar256._24_4_,
                                                  CONCAT420(fVar214 * pfVar31[5] + auVar256._20_4_,
                                                            CONCAT416(fVar213 * pfVar31[4] +
                                                                      auVar256._16_4_,
                                                                      CONCAT412(fVar210 * pfVar31[3]
                                                                                + auVar256._12_4_,
                                                                                CONCAT48(fVar207 * 
                                                  pfVar31[2] + auVar256._8_4_,
                                                  CONCAT44(fVar263 * pfVar31[1] + auVar256._4_4_,
                                                           fVar262 * *pfVar31 + auVar256._0_4_))))))
                                       ));
          auVar62 = ZEXT3264(CONCAT428(in_register_000014dc + auVar62._28_4_,
                                       CONCAT424(fVar215 * pfVar29[6] + auVar62._24_4_,
                                                 CONCAT420(fVar214 * pfVar29[5] + auVar62._20_4_,
                                                           CONCAT416(fVar213 * pfVar29[4] +
                                                                     auVar62._16_4_,
                                                                     CONCAT412(fVar210 * pfVar29[3]
                                                                               + auVar62._12_4_,
                                                                               CONCAT48(fVar207 * 
                                                  pfVar29[2] + auVar62._8_4_,
                                                  CONCAT44(fVar263 * pfVar29[1] + auVar62._4_4_,
                                                           fVar262 * *pfVar29 + auVar62._0_4_)))))))
                            );
          pfVar31 = (float *)((long)pvVar12 + lVar42 + local_158);
          auVar270 = ZEXT3264(CONCAT428(pfVar33[7] + auVar270._28_4_,
                                        CONCAT424(fVar215 * pfVar31[6] + auVar270._24_4_,
                                                  CONCAT420(fVar214 * pfVar31[5] + auVar270._20_4_,
                                                            CONCAT416(fVar213 * pfVar31[4] +
                                                                      auVar270._16_4_,
                                                                      CONCAT412(fVar210 * pfVar31[3]
                                                                                + auVar270._12_4_,
                                                                                CONCAT48(fVar207 * 
                                                  pfVar31[2] + auVar270._8_4_,
                                                  CONCAT44(fVar263 * pfVar31[1] + auVar270._4_4_,
                                                           fVar262 * *pfVar31 + auVar270._0_4_))))))
                                       ));
          iVar38 = iVar38 + 8;
          lVar42 = lVar42 + 0x20;
          lVar36 = lVar36 + 8;
        }
        for (; (int)lVar36 < iVar35; lVar36 = lVar36 + 1) {
          auVar112 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar12 + lVar36 * 4 + lVar44)),
                                   ZEXT416(*(uint *)((long)pvVar12 + lVar36 * 4 + lVar40)),0x10);
          auVar112 = vinsertps_avx(auVar112,ZEXT416(*(uint *)((long)pvVar12 + lVar36 * 4 + local_118
                                                             )),0x20);
          auVar112 = vinsertps_avx(auVar112,ZEXT416(*(uint *)((long)pvVar12 + lVar36 * 4 + local_158
                                                             )),0x30);
          auVar164 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar12 + lVar36 * 4 + uVar30)),
                                   ZEXT416(*(uint *)((long)pvVar12 + lVar36 * 4 + lVar32)),0x10);
          auVar164 = vinsertps_avx(auVar164,ZEXT416(*(uint *)((long)pvVar12 + lVar36 * 4 + lVar34)),
                                   0x20);
          auVar164 = vinsertps_avx(auVar164,ZEXT416(*(uint *)((long)pvVar12 + lVar36 * 4 + lVar39)),
                                   0x30);
          in_ZMM10 = ZEXT1664(auVar164);
          in_register_000014dc = local_e8[lVar36];
          fVar211 = auVar164._0_4_ * in_register_000014dc + fVar211;
          fVar212 = auVar164._4_4_ * in_register_000014dc + fVar212;
          fVar254 = auVar164._8_4_ * in_register_000014dc + fVar254;
          fVar257 = auVar164._12_4_ * in_register_000014dc + fVar257;
          fVar258 = auVar112._0_4_ * in_register_000014dc + fVar258;
          fVar259 = auVar112._4_4_ * in_register_000014dc + fVar259;
          fVar260 = auVar112._8_4_ * in_register_000014dc + fVar260;
          fVar261 = auVar112._12_4_ + fVar261;
        }
        auVar56 = vhaddps_avx(auVar237._0_32_,auVar225._0_32_);
        auVar264 = vhaddps_avx(auVar180._0_32_,auVar155._0_32_);
        auVar264 = vhaddps_avx(auVar56,auVar264);
        in_ZMM2 = ZEXT3264(auVar264);
        auVar56 = vhaddps_avx(auVar102._0_32_,auVar256._0_32_);
        auVar209 = vhaddps_avx(auVar62._0_32_,auVar270._0_32_);
        auVar209 = vhaddps_avx(auVar56,auVar209);
        auVar56 = vblendps_avx(auVar264,auVar209,0xf0);
        auVar264 = vperm2f128_avx(auVar264,auVar209,0x21);
        fVar211 = auVar264._0_4_ + fVar211 + auVar56._0_4_;
        fVar212 = auVar264._4_4_ + fVar212 + auVar56._4_4_;
        auVar209._0_8_ = CONCAT44(fVar212,fVar211);
        auVar209._8_4_ = auVar264._8_4_ + fVar254 + auVar56._8_4_;
        auVar209._12_4_ = auVar264._12_4_ + fVar257 + auVar56._12_4_;
        auVar209._16_4_ = auVar264._16_4_ + fVar258 + auVar56._16_4_;
        auVar209._20_4_ = auVar264._20_4_ + fVar259 + auVar56._20_4_;
        auVar209._24_4_ = auVar264._24_4_ + fVar260 + auVar56._24_4_;
        auVar209._28_4_ = auVar264._28_4_ + fVar261 + auVar56._28_4_;
        auVar264 = auVar209;
        if (5 < iVar26 - 1U) goto switchD_002c2770_caseD_1;
        auVar91 = auVar267._0_32_;
        auVar264 = vmaxps_avx(auVar91,auVar209);
        fVar207 = auVar266._0_4_;
        fVar210 = auVar266._4_4_;
        fVar213 = auVar266._8_4_;
        fVar214 = auVar266._12_4_;
        fVar215 = auVar266._16_4_;
        fVar216 = auVar266._20_4_;
        fVar104 = auVar266._24_4_;
        fVar105 = auVar266._28_4_;
        auVar205 = auVar206._0_32_;
        fVar254 = auVar206._0_4_;
        fVar257 = auVar206._4_4_;
        fVar258 = auVar206._8_4_;
        fVar259 = auVar206._12_4_;
        fVar260 = auVar206._16_4_;
        fVar261 = auVar206._20_4_;
        fVar262 = auVar206._24_4_;
        fVar263 = auVar206._28_4_;
        switch(iVar26) {
        case 2:
          auVar56 = vminps_avx(auVar91,auVar209);
          fVar211 = **(float **)(&this->field_0xe8 + (long)p_Var9);
          in_ZMM2 = ZEXT3264(CONCAT428(fVar211,CONCAT424(fVar211,CONCAT420(fVar211,CONCAT416(fVar211
                                                  ,CONCAT412(fVar211,CONCAT48(fVar211,CONCAT44(
                                                  fVar211,fVar211))))))));
          auVar15._4_4_ = fVar211 * auVar56._4_4_;
          auVar15._0_4_ = fVar211 * auVar56._0_4_;
          auVar15._8_4_ = fVar211 * auVar56._8_4_;
          auVar15._12_4_ = fVar211 * auVar56._12_4_;
          auVar15._16_4_ = fVar211 * auVar56._16_4_;
          auVar15._20_4_ = fVar211 * auVar56._20_4_;
          auVar15._24_4_ = fVar211 * auVar56._24_4_;
          auVar15._28_4_ = auVar56._28_4_;
          goto LAB_002c2be9;
        case 3:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar57._4_4_ = uVar7;
          auVar57._0_4_ = uVar7;
          auVar57._8_4_ = uVar7;
          auVar57._12_4_ = uVar7;
          auVar57._16_4_ = uVar7;
          auVar57._20_4_ = uVar7;
          auVar57._24_4_ = uVar7;
          auVar57._28_4_ = uVar7;
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
          auVar97._4_4_ = uVar7;
          auVar97._0_4_ = uVar7;
          auVar97._8_4_ = uVar7;
          auVar97._12_4_ = uVar7;
          auVar97._16_4_ = uVar7;
          auVar97._20_4_ = uVar7;
          auVar97._24_4_ = uVar7;
          auVar97._28_4_ = uVar7;
          auVar56 = vmaxps_avx(auVar209,auVar57);
          auVar264 = vminps_avx(auVar56,auVar97);
          break;
        case 4:
          auVar58._0_8_ = auVar209._0_8_ ^ 0x8000000080000000;
          auVar58._8_4_ = -auVar209._8_4_;
          auVar58._12_4_ = -auVar209._12_4_;
          auVar58._16_4_ = -auVar209._16_4_;
          auVar58._20_4_ = -auVar209._20_4_;
          auVar58._24_4_ = -auVar209._24_4_;
          auVar58._28_4_ = -auVar209._28_4_;
          auVar98._8_4_ = 0x42b0c0a5;
          auVar98._0_8_ = 0x42b0c0a542b0c0a5;
          auVar98._12_4_ = 0x42b0c0a5;
          auVar98._16_4_ = 0x42b0c0a5;
          auVar98._20_4_ = 0x42b0c0a5;
          auVar98._24_4_ = 0x42b0c0a5;
          auVar98._28_4_ = 0x42b0c0a5;
          auVar56 = vminps_avx(auVar58,auVar98);
          auVar99._8_4_ = 0xc2b0c0a5;
          auVar99._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar99._12_4_ = 0xc2b0c0a5;
          auVar99._16_4_ = 0xc2b0c0a5;
          auVar99._20_4_ = 0xc2b0c0a5;
          auVar99._24_4_ = 0xc2b0c0a5;
          auVar99._28_4_ = 0xc2b0c0a5;
          auVar264 = vmaxps_avx(auVar56,auVar99);
          auVar100._0_4_ = fVar207 + auVar264._0_4_ * 1.442695;
          auVar100._4_4_ = fVar210 + auVar264._4_4_ * 1.442695;
          auVar100._8_4_ = fVar213 + auVar264._8_4_ * 1.442695;
          auVar100._12_4_ = fVar214 + auVar264._12_4_ * 1.442695;
          auVar100._16_4_ = fVar215 + auVar264._16_4_ * 1.442695;
          auVar100._20_4_ = fVar216 + auVar264._20_4_ * 1.442695;
          auVar100._24_4_ = fVar104 + auVar264._24_4_ * 1.442695;
          auVar100._28_4_ = fVar105 + 1.442695;
          auVar209 = vroundps_avx(auVar100,1);
          auVar56 = vcmpps_avx(auVar100,auVar209,1);
          auVar56 = vandps_avx(auVar56,auVar205);
          auVar56 = vsubps_avx(auVar209,auVar56);
          fVar211 = auVar264._0_4_ + auVar56._0_4_ * -0.6931472;
          fVar212 = auVar264._4_4_ + auVar56._4_4_ * -0.6931472;
          fVar105 = auVar264._8_4_ + auVar56._8_4_ * -0.6931472;
          fVar157 = auVar264._12_4_ + auVar56._12_4_ * -0.6931472;
          fVar158 = auVar264._16_4_ + auVar56._16_4_ * -0.6931472;
          fVar182 = auVar264._20_4_ + auVar56._20_4_ * -0.6931472;
          fVar183 = auVar264._24_4_ + auVar56._24_4_ * -0.6931472;
          auVar69._0_4_ = (int)auVar56._0_4_;
          auVar69._4_4_ = (int)auVar56._4_4_;
          auVar69._8_4_ = (int)auVar56._8_4_;
          auVar69._12_4_ = (int)auVar56._12_4_;
          auVar101._16_4_ = (int)auVar56._16_4_;
          auVar101._0_16_ = auVar69;
          auVar101._20_4_ = (int)auVar56._20_4_;
          auVar101._24_4_ = (int)auVar56._24_4_;
          auVar101._28_4_ = (int)auVar56._28_4_;
          auVar164 = vpslld_avx(auVar69,0x17);
          auVar112 = vpslld_avx(auVar101._16_16_,0x17);
          auVar176._8_4_ = 0x3f800000;
          auVar176._0_8_ = 0x3f8000003f800000;
          auVar176._12_4_ = 0x3f800000;
          auVar112 = vpaddd_avx(auVar112,auVar176);
          auVar164 = vpaddd_avx(auVar164,auVar176);
          in_ZMM2 = ZEXT1664(auVar164);
          auVar59._0_4_ =
               (fVar211 + fVar254 +
               fVar211 * fVar211 *
               (fVar207 +
               ((((fVar211 * 0.00019875691 + 0.0013981999) * fVar211 + 0.008333452) * fVar211 +
                0.041665796) * fVar211 + 0.16666666) * fVar211)) * auVar164._0_4_ + fVar254;
          auVar59._4_4_ =
               (fVar212 + fVar257 +
               fVar212 * fVar212 *
               (fVar210 +
               ((((fVar212 * 0.00019875691 + 0.0013981999) * fVar212 + 0.008333452) * fVar212 +
                0.041665796) * fVar212 + 0.16666666) * fVar212)) * auVar164._4_4_ + fVar257;
          auVar59._8_4_ =
               (fVar105 + fVar258 +
               fVar105 * fVar105 *
               (fVar213 +
               ((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105 +
                0.041665796) * fVar105 + 0.16666666) * fVar105)) * auVar164._8_4_ + fVar258;
          auVar59._12_4_ =
               (fVar157 + fVar259 +
               fVar157 * fVar157 *
               (fVar214 +
               ((((fVar157 * 0.00019875691 + 0.0013981999) * fVar157 + 0.008333452) * fVar157 +
                0.041665796) * fVar157 + 0.16666666) * fVar157)) * auVar164._12_4_ + fVar259;
          auVar59._16_4_ =
               (fVar158 + fVar260 +
               fVar158 * fVar158 *
               (fVar215 +
               ((((fVar158 * 0.00019875691 + 0.0013981999) * fVar158 + 0.008333452) * fVar158 +
                0.041665796) * fVar158 + 0.16666666) * fVar158)) * auVar112._0_4_ + fVar260;
          auVar59._20_4_ =
               (fVar182 + fVar261 +
               fVar182 * fVar182 *
               (fVar216 +
               ((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452) * fVar182 +
                0.041665796) * fVar182 + 0.16666666) * fVar182)) * auVar112._4_4_ + fVar261;
          auVar59._24_4_ =
               (fVar183 + fVar262 +
               fVar183 * fVar183 *
               (fVar104 +
               ((((fVar183 * 0.00019875691 + 0.0013981999) * fVar183 + 0.008333452) * fVar183 +
                0.041665796) * fVar183 + 0.16666666) * fVar183)) * auVar112._8_4_ + fVar262;
          auVar59._28_4_ = auVar264._28_4_ + -0.6931472 + fVar263 + -0.6931472 + fVar263;
          auVar15 = vrcpps_avx(auVar59);
          auVar24._4_4_ = auVar59._4_4_ * auVar15._4_4_;
          auVar24._0_4_ = auVar59._0_4_ * auVar15._0_4_;
          auVar24._8_4_ = auVar59._8_4_ * auVar15._8_4_;
          auVar24._12_4_ = auVar59._12_4_ * auVar15._12_4_;
          auVar24._16_4_ = auVar59._16_4_ * auVar15._16_4_;
          auVar24._20_4_ = auVar59._20_4_ * auVar15._20_4_;
          auVar24._24_4_ = auVar59._24_4_ * auVar15._24_4_;
          auVar24._28_4_ = auVar59._28_4_;
          auVar56 = vsubps_avx(auVar205,auVar24);
          auVar264._4_4_ = auVar15._4_4_ * auVar56._4_4_;
          auVar264._0_4_ = auVar15._0_4_ * auVar56._0_4_;
          auVar264._8_4_ = auVar15._8_4_ * auVar56._8_4_;
          auVar264._12_4_ = auVar15._12_4_ * auVar56._12_4_;
          auVar264._16_4_ = auVar15._16_4_ * auVar56._16_4_;
          auVar264._20_4_ = auVar15._20_4_ * auVar56._20_4_;
          auVar264._24_4_ = auVar15._24_4_ * auVar56._24_4_;
          auVar264._28_4_ = auVar56._28_4_;
LAB_002c2be9:
          auVar60._0_4_ = auVar15._0_4_ + auVar264._0_4_;
          auVar60._4_4_ = auVar15._4_4_ + auVar264._4_4_;
          auVar60._8_4_ = auVar15._8_4_ + auVar264._8_4_;
          auVar60._12_4_ = auVar15._12_4_ + auVar264._12_4_;
          auVar60._16_4_ = auVar15._16_4_ + auVar264._16_4_;
          auVar60._20_4_ = auVar15._20_4_ + auVar264._20_4_;
          auVar60._24_4_ = auVar15._24_4_ + auVar264._24_4_;
          auVar60._28_4_ = auVar15._28_4_ + auVar264._28_4_;
          auVar264 = auVar60;
          break;
        case 5:
          auVar251._8_4_ = 0x42b0c0a5;
          auVar251._0_8_ = 0x42b0c0a542b0c0a5;
          auVar251._12_4_ = 0x42b0c0a5;
          auVar251._16_4_ = 0x42b0c0a5;
          auVar251._20_4_ = 0x42b0c0a5;
          auVar251._24_4_ = 0x42b0c0a5;
          auVar251._28_4_ = 0x42b0c0a5;
          auVar264 = vminps_avx(auVar251,auVar209);
          auVar253._8_4_ = 0xc2b0c0a5;
          auVar253._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar253._12_4_ = 0xc2b0c0a5;
          auVar253._16_4_ = 0xc2b0c0a5;
          auVar253._20_4_ = 0xc2b0c0a5;
          auVar253._24_4_ = 0xc2b0c0a5;
          auVar253._28_4_ = 0xc2b0c0a5;
          auVar264 = vmaxps_avx(auVar253,auVar264);
          auVar89._0_4_ = fVar207 + auVar264._0_4_ * 1.442695;
          auVar89._4_4_ = fVar210 + auVar264._4_4_ * 1.442695;
          auVar89._8_4_ = fVar213 + auVar264._8_4_ * 1.442695;
          auVar89._12_4_ = fVar214 + auVar264._12_4_ * 1.442695;
          auVar89._16_4_ = fVar215 + auVar264._16_4_ * 1.442695;
          auVar89._20_4_ = fVar216 + auVar264._20_4_ * 1.442695;
          auVar89._24_4_ = fVar104 + auVar264._24_4_ * 1.442695;
          auVar89._28_4_ = fVar105 + auVar56._28_4_;
          auVar91 = vroundps_avx(auVar89,1);
          auVar56 = vcmpps_avx(auVar89,auVar91,1);
          auVar56 = vandps_avx(auVar56,auVar205);
          auVar56 = vsubps_avx(auVar91,auVar56);
          in_register_000014dc = 0.6931472;
          auVar21._4_4_ = auVar56._4_4_ * 0.6931472;
          auVar21._0_4_ = auVar56._0_4_ * 0.6931472;
          auVar21._8_4_ = auVar56._8_4_ * 0.6931472;
          auVar21._12_4_ = auVar56._12_4_ * 0.6931472;
          auVar21._16_4_ = auVar56._16_4_ * 0.6931472;
          auVar21._20_4_ = auVar56._20_4_ * 0.6931472;
          auVar21._24_4_ = auVar56._24_4_ * 0.6931472;
          auVar21._28_4_ = auVar91._28_4_;
          auVar264 = vsubps_avx(auVar264,auVar21);
          fVar157 = auVar264._0_4_;
          fVar158 = auVar264._4_4_;
          fVar182 = auVar264._8_4_;
          fVar183 = auVar264._12_4_;
          fVar227 = auVar264._16_4_;
          fVar228 = auVar264._20_4_;
          fVar239 = auVar264._24_4_;
          auVar112._0_4_ = (int)auVar56._0_4_;
          auVar112._4_4_ = (int)auVar56._4_4_;
          auVar112._8_4_ = (int)auVar56._8_4_;
          auVar112._12_4_ = (int)auVar56._12_4_;
          auVar90._16_4_ = (int)auVar56._16_4_;
          auVar90._0_16_ = auVar112;
          auVar90._20_4_ = (int)auVar56._20_4_;
          auVar90._24_4_ = (int)auVar56._24_4_;
          auVar90._28_4_ = (int)auVar56._28_4_;
          auVar164 = vpslld_avx(auVar112,0x17);
          auVar112 = vpslld_avx(auVar90._16_16_,0x17);
          auVar247._8_4_ = 0x3f800000;
          auVar247._0_8_ = 0x3f8000003f800000;
          auVar247._12_4_ = 0x3f800000;
          auVar112 = vpaddd_avx(auVar247,auVar112);
          auVar164 = vpaddd_avx(auVar247,auVar164);
          auVar54._0_4_ =
               (fVar157 + fVar254 +
               fVar157 * fVar157 *
               (fVar207 +
               ((((fVar157 * 0.00019875691 + 0.0013981999) * fVar157 + 0.008333452) * fVar157 +
                0.041665796) * fVar157 + 0.16666666) * fVar157)) * auVar164._0_4_ + fVar254;
          auVar54._4_4_ =
               (fVar158 + fVar257 +
               fVar158 * fVar158 *
               (fVar210 +
               ((((fVar158 * 0.00019875691 + 0.0013981999) * fVar158 + 0.008333452) * fVar158 +
                0.041665796) * fVar158 + 0.16666666) * fVar158)) * auVar164._4_4_ + fVar257;
          auVar54._8_4_ =
               (fVar182 + fVar258 +
               fVar182 * fVar182 *
               (fVar213 +
               ((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452) * fVar182 +
                0.041665796) * fVar182 + 0.16666666) * fVar182)) * auVar164._8_4_ + fVar258;
          auVar54._12_4_ =
               (fVar183 + fVar259 +
               fVar183 * fVar183 *
               (fVar214 +
               ((((fVar183 * 0.00019875691 + 0.0013981999) * fVar183 + 0.008333452) * fVar183 +
                0.041665796) * fVar183 + 0.16666666) * fVar183)) * auVar164._12_4_ + fVar259;
          auVar54._16_4_ =
               (fVar227 + fVar260 +
               fVar227 * fVar227 *
               (fVar215 +
               ((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227 +
                0.041665796) * fVar227 + 0.16666666) * fVar227)) * auVar112._0_4_ + fVar260;
          auVar54._20_4_ =
               (fVar228 + fVar261 +
               fVar228 * fVar228 *
               (fVar216 +
               ((((fVar228 * 0.00019875691 + 0.0013981999) * fVar228 + 0.008333452) * fVar228 +
                0.041665796) * fVar228 + 0.16666666) * fVar228)) * auVar112._4_4_ + fVar261;
          auVar54._24_4_ =
               (fVar239 + fVar262 +
               fVar239 * fVar239 *
               (fVar104 +
               ((((fVar239 * 0.00019875691 + 0.0013981999) * fVar239 + 0.008333452) * fVar239 +
                0.041665796) * fVar239 + 0.16666666) * fVar239)) * auVar112._8_4_ + fVar262;
          auVar54._28_4_ = auVar264._28_4_ + fVar263 + auVar91._28_4_ + fVar263;
          auVar91._8_4_ = 0x800000;
          auVar91._0_8_ = 0x80000000800000;
          auVar91._12_4_ = 0x800000;
          auVar91._16_4_ = 0x800000;
          auVar91._20_4_ = 0x800000;
          auVar91._24_4_ = 0x800000;
          auVar91._28_4_ = 0x800000;
          auVar91 = vmaxps_avx(auVar54,auVar91);
          auVar112 = vpsrld_avx(auVar91._16_16_,0x17);
          auVar92._8_4_ = 0x807fffff;
          auVar92._0_8_ = 0x807fffff807fffff;
          auVar92._12_4_ = 0x807fffff;
          auVar92._16_4_ = 0x807fffff;
          auVar92._20_4_ = 0x807fffff;
          auVar92._24_4_ = 0x807fffff;
          auVar92._28_4_ = 0x807fffff;
          auVar56 = vandps_avx(auVar91,auVar92);
          auVar61 = vorps_avx(auVar266._0_32_,auVar56);
          auVar224._8_4_ = 0x3f3504f3;
          auVar224._0_8_ = 0x3f3504f33f3504f3;
          auVar224._12_4_ = 0x3f3504f3;
          auVar224._16_4_ = 0x3f3504f3;
          auVar224._20_4_ = 0x3f3504f3;
          auVar224._24_4_ = 0x3f3504f3;
          auVar224._28_4_ = 0x3f3504f3;
          auVar264 = vcmpps_avx(auVar224,auVar61,2);
          auVar56 = vandnps_avx(auVar264,auVar61);
          in_ZMM10 = ZEXT3264(CONCAT428(0xbf800000,
                                        CONCAT424(0xbf800000,
                                                  CONCAT420(0xbf800000,
                                                            CONCAT416(0xbf800000,
                                                                      CONCAT412(0xbf800000,
                                                                                CONCAT48(0xbf800000,
                                                                                                                                                                                  
                                                  0xbf800000bf800000)))))));
          fVar157 = auVar56._0_4_ + auVar61._0_4_ + -1.0;
          fVar158 = auVar56._4_4_ + auVar61._4_4_ + -1.0;
          fVar182 = auVar56._8_4_ + auVar61._8_4_ + -1.0;
          fVar183 = auVar56._12_4_ + auVar61._12_4_ + -1.0;
          fVar227 = auVar56._16_4_ + auVar61._16_4_ + -1.0;
          fVar228 = auVar56._20_4_ + auVar61._20_4_ + -1.0;
          fVar239 = auVar56._24_4_ + auVar61._24_4_ + -1.0;
          auVar112 = vpsubd_avx(auVar112,auVar264._16_16_);
          auVar164 = vpsrld_avx(auVar91._0_16_,0x17);
          auVar235._8_4_ = 0xffffff81;
          auVar235._0_8_ = 0xffffff81ffffff81;
          auVar235._12_4_ = 0xffffff81;
          auVar112 = vpaddd_avx(auVar235,auVar112);
          auVar164 = vpsubd_avx(auVar164,auVar264._0_16_);
          auVar164 = vpaddd_avx(auVar235,auVar164);
          auVar153._16_16_ = auVar112;
          auVar153._0_16_ = auVar164;
          auVar264 = vcmpps_avx(auVar54,_DAT_004f1a40,2);
          auVar91 = vcvtdq2ps_avx(auVar153);
          auVar22._4_4_ =
               (auVar91._4_4_ * 0.6931472 + fVar158 +
               fVar158 * fVar158 *
               (((((((((fVar158 * 0.070376836 + -0.1151461) * fVar158 + 0.116769984) * fVar158 +
                     -0.12420141) * fVar158 + 0.14249323) * fVar158 + -0.16668057) * fVar158 +
                  0.20000714) * fVar158 + -0.24999994) * fVar158 + 0.3333333) * fVar158 + -0.5)) *
               -2.0;
          auVar22._0_4_ =
               (auVar91._0_4_ * 0.6931472 + fVar157 +
               fVar157 * fVar157 *
               (((((((((fVar157 * 0.070376836 + -0.1151461) * fVar157 + 0.116769984) * fVar157 +
                     -0.12420141) * fVar157 + 0.14249323) * fVar157 + -0.16668057) * fVar157 +
                  0.20000714) * fVar157 + -0.24999994) * fVar157 + 0.3333333) * fVar157 + -0.5)) *
               -2.0;
          auVar22._8_4_ =
               (auVar91._8_4_ * 0.6931472 + fVar182 +
               fVar182 * fVar182 *
               (((((((((fVar182 * 0.070376836 + -0.1151461) * fVar182 + 0.116769984) * fVar182 +
                     -0.12420141) * fVar182 + 0.14249323) * fVar182 + -0.16668057) * fVar182 +
                  0.20000714) * fVar182 + -0.24999994) * fVar182 + 0.3333333) * fVar182 + -0.5)) *
               -2.0;
          auVar22._12_4_ =
               (auVar91._12_4_ * 0.6931472 + fVar183 +
               fVar183 * fVar183 *
               (((((((((fVar183 * 0.070376836 + -0.1151461) * fVar183 + 0.116769984) * fVar183 +
                     -0.12420141) * fVar183 + 0.14249323) * fVar183 + -0.16668057) * fVar183 +
                  0.20000714) * fVar183 + -0.24999994) * fVar183 + 0.3333333) * fVar183 + -0.5)) *
               -2.0;
          auVar22._16_4_ =
               (auVar91._16_4_ * 0.6931472 + fVar227 +
               fVar227 * fVar227 *
               (((((((((fVar227 * 0.070376836 + -0.1151461) * fVar227 + 0.116769984) * fVar227 +
                     -0.12420141) * fVar227 + 0.14249323) * fVar227 + -0.16668057) * fVar227 +
                  0.20000714) * fVar227 + -0.24999994) * fVar227 + 0.3333333) * fVar227 + -0.5)) *
               -2.0;
          auVar22._20_4_ =
               (auVar91._20_4_ * 0.6931472 + fVar228 +
               fVar228 * fVar228 *
               (((((((((fVar228 * 0.070376836 + -0.1151461) * fVar228 + 0.116769984) * fVar228 +
                     -0.12420141) * fVar228 + 0.14249323) * fVar228 + -0.16668057) * fVar228 +
                  0.20000714) * fVar228 + -0.24999994) * fVar228 + 0.3333333) * fVar228 + -0.5)) *
               -2.0;
          auVar22._24_4_ =
               (auVar91._24_4_ * 0.6931472 + fVar239 +
               fVar239 * fVar239 *
               (((((((((fVar239 * 0.070376836 + -0.1151461) * fVar239 + 0.116769984) * fVar239 +
                     -0.12420141) * fVar239 + 0.14249323) * fVar239 + -0.16668057) * fVar239 +
                  0.20000714) * fVar239 + -0.24999994) * fVar239 + 0.3333333) * fVar239 + -0.5)) *
               -2.0;
          auVar22._28_4_ = auVar91._28_4_ + auVar56._28_4_ + auVar61._28_4_ + -1.0 + 0.0;
          auVar154._8_4_ = 0x7fffffff;
          auVar154._0_8_ = 0x7fffffff7fffffff;
          auVar154._12_4_ = 0x7fffffff;
          auVar154._16_4_ = 0x7fffffff;
          auVar154._20_4_ = 0x7fffffff;
          auVar154._24_4_ = 0x7fffffff;
          auVar154._28_4_ = 0x7fffffff;
          auVar56 = vblendvps_avx(auVar22,auVar154,auVar264);
          auVar93._8_4_ = 0x42b0c0a5;
          auVar93._0_8_ = 0x42b0c0a542b0c0a5;
          auVar93._12_4_ = 0x42b0c0a5;
          auVar93._16_4_ = 0x42b0c0a5;
          auVar93._20_4_ = 0x42b0c0a5;
          auVar93._24_4_ = 0x42b0c0a5;
          auVar93._28_4_ = 0x42b0c0a5;
          auVar56 = vminps_avx(auVar56,auVar93);
          auVar94._8_4_ = 0xc2b0c0a5;
          auVar94._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar94._12_4_ = 0xc2b0c0a5;
          auVar94._16_4_ = 0xc2b0c0a5;
          auVar94._20_4_ = 0xc2b0c0a5;
          auVar94._24_4_ = 0xc2b0c0a5;
          auVar94._28_4_ = 0xc2b0c0a5;
          auVar264 = vmaxps_avx(auVar56,auVar94);
          auVar95._0_4_ = fVar207 + auVar264._0_4_ * 1.442695;
          auVar95._4_4_ = fVar210 + auVar264._4_4_ * 1.442695;
          auVar95._8_4_ = fVar213 + auVar264._8_4_ * 1.442695;
          auVar95._12_4_ = fVar214 + auVar264._12_4_ * 1.442695;
          auVar95._16_4_ = fVar215 + auVar264._16_4_ * 1.442695;
          auVar95._20_4_ = fVar216 + auVar264._20_4_ * 1.442695;
          auVar95._24_4_ = fVar104 + auVar264._24_4_ * 1.442695;
          auVar95._28_4_ = fVar105 + 1.442695;
          auVar91 = vroundps_avx(auVar95,1);
          auVar56 = vcmpps_avx(auVar95,auVar91,1);
          auVar56 = vandps_avx(auVar56,auVar205);
          auVar56 = vsubps_avx(auVar91,auVar56);
          auVar23._4_4_ = auVar56._4_4_ * 0.6931472;
          auVar23._0_4_ = auVar56._0_4_ * 0.6931472;
          auVar23._8_4_ = auVar56._8_4_ * 0.6931472;
          auVar23._12_4_ = auVar56._12_4_ * 0.6931472;
          auVar23._16_4_ = auVar56._16_4_ * 0.6931472;
          auVar23._20_4_ = auVar56._20_4_ * 0.6931472;
          auVar23._24_4_ = auVar56._24_4_ * 0.6931472;
          auVar23._28_4_ = auVar91._28_4_;
          auVar264 = vsubps_avx(auVar264,auVar23);
          fVar105 = auVar264._0_4_;
          fVar157 = auVar264._4_4_;
          fVar158 = auVar264._8_4_;
          fVar182 = auVar264._12_4_;
          fVar183 = auVar264._16_4_;
          fVar227 = auVar264._20_4_;
          fVar228 = auVar264._24_4_;
          auVar266 = ZEXT3264(auVar266._0_32_);
          auVar267 = ZEXT864(0) << 0x20;
          auVar206 = ZEXT3264(auVar205);
          auVar164._0_4_ = (int)auVar56._0_4_;
          auVar164._4_4_ = (int)auVar56._4_4_;
          auVar164._8_4_ = (int)auVar56._8_4_;
          auVar164._12_4_ = (int)auVar56._12_4_;
          auVar96._16_4_ = (int)auVar56._16_4_;
          auVar96._0_16_ = auVar164;
          auVar96._20_4_ = (int)auVar56._20_4_;
          auVar96._24_4_ = (int)auVar56._24_4_;
          auVar96._28_4_ = (int)auVar56._28_4_;
          auVar164 = vpslld_avx(auVar164,0x17);
          auVar112 = vpslld_avx(auVar96._16_16_,0x17);
          auVar112 = vpaddd_avx(auVar247,auVar112);
          auVar164 = vpaddd_avx(auVar247,auVar164);
          auVar55._0_4_ =
               (fVar105 + fVar254 +
               fVar105 * fVar105 *
               (fVar207 +
               ((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105 +
                0.041665796) * fVar105 + 0.16666666) * fVar105)) * auVar164._0_4_ + fVar254;
          auVar55._4_4_ =
               (fVar157 + fVar257 +
               fVar157 * fVar157 *
               (fVar210 +
               ((((fVar157 * 0.00019875691 + 0.0013981999) * fVar157 + 0.008333452) * fVar157 +
                0.041665796) * fVar157 + 0.16666666) * fVar157)) * auVar164._4_4_ + fVar257;
          auVar55._8_4_ =
               (fVar158 + fVar258 +
               fVar158 * fVar158 *
               (fVar213 +
               ((((fVar158 * 0.00019875691 + 0.0013981999) * fVar158 + 0.008333452) * fVar158 +
                0.041665796) * fVar158 + 0.16666666) * fVar158)) * auVar164._8_4_ + fVar258;
          auVar55._12_4_ =
               (fVar182 + fVar259 +
               fVar182 * fVar182 *
               (fVar214 +
               ((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452) * fVar182 +
                0.041665796) * fVar182 + 0.16666666) * fVar182)) * auVar164._12_4_ + fVar259;
          auVar55._16_4_ =
               (fVar183 + fVar260 +
               fVar183 * fVar183 *
               (fVar215 +
               ((((fVar183 * 0.00019875691 + 0.0013981999) * fVar183 + 0.008333452) * fVar183 +
                0.041665796) * fVar183 + 0.16666666) * fVar183)) * auVar112._0_4_ + fVar260;
          auVar55._20_4_ =
               (fVar227 + fVar261 +
               fVar227 * fVar227 *
               (fVar216 +
               ((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227 +
                0.041665796) * fVar227 + 0.16666666) * fVar227)) * auVar112._4_4_ + fVar261;
          auVar55._24_4_ =
               (fVar228 + fVar262 +
               fVar228 * fVar228 *
               (fVar104 +
               ((((fVar228 * 0.00019875691 + 0.0013981999) * fVar228 + 0.008333452) * fVar228 +
                0.041665796) * fVar228 + 0.16666666) * fVar228)) * auVar112._8_4_ + fVar262;
          auVar55._28_4_ = auVar264._28_4_ + fVar263 + auVar91._28_4_ + fVar263;
          auVar56 = vrcpps_avx(auVar55);
          fVar254 = auVar56._0_4_;
          fVar263 = fVar254 + fVar254;
          fVar257 = auVar56._4_4_;
          fVar207 = fVar257 + fVar257;
          fVar258 = auVar56._8_4_;
          fVar210 = fVar258 + fVar258;
          fVar259 = auVar56._12_4_;
          fVar213 = fVar259 + fVar259;
          fVar260 = auVar56._16_4_;
          fVar214 = fVar260 + fVar260;
          fVar261 = auVar56._20_4_;
          fVar215 = fVar261 + fVar261;
          fVar262 = auVar56._24_4_;
          fVar216 = fVar262 + fVar262;
          fVar104 = auVar56._28_4_ + auVar56._28_4_;
          in_ZMM2 = ZEXT3264(CONCAT428(fVar104,CONCAT424(fVar216,CONCAT420(fVar215,CONCAT416(fVar214
                                                  ,CONCAT412(fVar213,CONCAT48(fVar210,CONCAT44(
                                                  fVar207,fVar263))))))));
          auVar205._4_4_ = auVar55._4_4_ * fVar207;
          auVar205._0_4_ = auVar55._0_4_ * fVar263;
          auVar205._8_4_ = auVar55._8_4_ * fVar210;
          auVar205._12_4_ = auVar55._12_4_ * fVar213;
          auVar205._16_4_ = auVar55._16_4_ * fVar214;
          auVar205._20_4_ = auVar55._20_4_ * fVar215;
          auVar205._24_4_ = auVar55._24_4_ * fVar216;
          auVar205._28_4_ = auVar55._28_4_;
          auVar179._8_4_ = 0x40000000;
          auVar179._0_8_ = 0x4000000040000000;
          auVar179._12_4_ = 0x40000000;
          auVar179._16_4_ = 0x40000000;
          auVar179._20_4_ = 0x40000000;
          auVar179._24_4_ = 0x40000000;
          auVar179._28_4_ = 0x40000000;
          auVar264 = vsubps_avx(auVar179,auVar205);
          auVar56._0_4_ = fVar263 + -1.0 + fVar254 * auVar264._0_4_;
          auVar56._4_4_ = fVar207 + -1.0 + fVar257 * auVar264._4_4_;
          auVar56._8_4_ = fVar210 + -1.0 + fVar258 * auVar264._8_4_;
          auVar56._12_4_ = fVar213 + -1.0 + fVar259 * auVar264._12_4_;
          auVar56._16_4_ = fVar214 + -1.0 + fVar260 * auVar264._16_4_;
          auVar56._20_4_ = fVar215 + -1.0 + fVar261 * auVar264._20_4_;
          auVar56._24_4_ = fVar216 + -1.0 + fVar262 * auVar264._24_4_;
          auVar56._28_4_ = fVar104 + -1.0 + auVar264._28_4_;
          goto LAB_002c2c17;
        case 6:
          fVar254 = **(float **)(&this->field_0xe8 + (long)p_Var9);
          fVar257 = (*(float **)(&this->field_0xe8 + (long)p_Var9))[1];
          auVar61._0_4_ = fVar254 * fVar211 + fVar257;
          auVar61._4_4_ = fVar254 * fVar212 + fVar257;
          auVar61._8_4_ = fVar254 * auVar209._8_4_ + fVar257;
          auVar61._12_4_ = fVar254 * auVar209._12_4_ + fVar257;
          auVar61._16_4_ = fVar254 * auVar209._16_4_ + fVar257;
          auVar61._20_4_ = fVar254 * auVar209._20_4_ + fVar257;
          auVar61._24_4_ = fVar254 * auVar209._24_4_ + fVar257;
          auVar61._28_4_ = fVar254 + fVar257;
          auVar56 = vmaxps_avx(auVar91,auVar61);
          auVar56 = vminps_avx(auVar56,auVar205);
LAB_002c2c17:
          auVar264._4_4_ = auVar56._4_4_ * fVar212;
          auVar264._0_4_ = auVar56._0_4_ * fVar211;
          auVar264._8_4_ = auVar56._8_4_ * auVar209._8_4_;
          auVar264._12_4_ = auVar56._12_4_ * auVar209._12_4_;
          auVar264._16_4_ = auVar56._16_4_ * auVar209._16_4_;
          auVar264._20_4_ = auVar56._20_4_ * auVar209._20_4_;
          auVar264._24_4_ = auVar56._24_4_ * auVar209._24_4_;
          auVar264._28_4_ = auVar56._28_4_;
        }
switchD_002c2770_caseD_1:
        *(undefined1 (*) [32])((long)top_blob->data + uVar28 * 0x20) = auVar264;
        uVar30 = uVar30 + local_98;
        lVar34 = lVar34 + local_98;
        lVar39 = lVar39 + local_98;
        lVar44 = lVar44 + local_98;
        lVar40 = lVar40 + local_98;
        local_118 = local_118 + local_98;
        local_158 = local_158 + local_98;
        lVar36 = lVar32 + local_98;
        local_80 = lVar32;
      }
      uVar30 = (long)(int)uVar8 & 0xfffffffffffffff8;
      uVar27 = uVar8 >> 2 & 1;
      lVar40 = lVar37 * uVar30 * 4;
      lVar36 = lVar37 * 0x10;
      lVar39 = (uVar30 + 1) * lVar37 * 4;
      lVar34 = (uVar30 + 2) * lVar37 * 4;
      lVar44 = (uVar30 + 3) * lVar37 * 4;
      auVar266 = ZEXT864(0);
      auVar267 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      for (uVar28 = 0; uVar28 != uVar27; uVar28 = uVar28 + 1) {
        lVar32 = uVar30 + uVar28 * 4;
        if (lVar11 == 0) {
          fVar211 = 0.0;
          fVar212 = 0.0;
          fVar254 = 0.0;
          fVar257 = 0.0;
        }
        else {
          pfVar31 = (float *)(lVar11 + lVar32 * 4);
          fVar211 = *pfVar31;
          fVar212 = pfVar31[1];
          fVar254 = pfVar31[2];
          fVar257 = pfVar31[3];
        }
        pvVar12 = (this->weight_data_tm).data;
        lVar42 = 0;
        auVar155 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar43 = 0;
        auVar270 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar62 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar102 = ZEXT1664(ZEXT816(0) << 0x40);
        for (iVar38 = 0; iVar38 + 7 < iVar35; iVar38 = iVar38 + 8) {
          pfVar31 = (float *)((long)local_e8 + lVar43);
          fVar259 = *pfVar31;
          fVar260 = pfVar31[1];
          fVar261 = pfVar31[2];
          fVar262 = pfVar31[3];
          fVar263 = pfVar31[4];
          fVar207 = pfVar31[5];
          fVar210 = pfVar31[6];
          pfVar29 = (float *)((long)pvVar12 + lVar43 + lVar40);
          fVar258 = in_ZMM2._28_4_;
          auVar155 = ZEXT3264(CONCAT428(auVar155._28_4_ + fVar258,
                                        CONCAT424(auVar155._24_4_ + fVar210 * pfVar29[6],
                                                  CONCAT420(auVar155._20_4_ + fVar207 * pfVar29[5],
                                                            CONCAT416(auVar155._16_4_ +
                                                                      fVar263 * pfVar29[4],
                                                                      CONCAT412(auVar155._12_4_ +
                                                                                fVar262 * pfVar29[3]
                                                                                ,CONCAT48(auVar155.
                                                  _8_4_ + fVar261 * pfVar29[2],
                                                  CONCAT44(auVar155._4_4_ + fVar260 * pfVar29[1],
                                                           auVar155._0_4_ + fVar259 * *pfVar29))))))
                                       ));
          pfVar29 = (float *)((long)pvVar12 + lVar43 + lVar39);
          in_ZMM2 = ZEXT3264(CONCAT428(fVar258,CONCAT424(fVar210 * pfVar29[6],
                                                         CONCAT420(fVar207 * pfVar29[5],
                                                                   CONCAT416(fVar263 * pfVar29[4],
                                                                             CONCAT412(fVar262 * 
                                                  pfVar29[3],
                                                  CONCAT48(fVar261 * pfVar29[2],
                                                           CONCAT44(fVar260 * pfVar29[1],
                                                                    fVar259 * *pfVar29))))))));
          pfVar33 = (float *)((long)pvVar12 + lVar43 + lVar34);
          auVar180._0_4_ = fVar259 * *pfVar33;
          auVar180._4_4_ = fVar260 * pfVar33[1];
          auVar180._8_4_ = fVar261 * pfVar33[2];
          auVar180._12_4_ = fVar262 * pfVar33[3];
          auVar180._16_4_ = fVar263 * pfVar33[4];
          auVar180._20_4_ = fVar207 * pfVar33[5];
          auVar180._28_36_ = auVar206._28_36_;
          auVar180._24_4_ = fVar210 * pfVar33[6];
          auVar270 = ZEXT3264(CONCAT428(fVar258 + auVar270._28_4_,
                                        CONCAT424(fVar210 * pfVar29[6] + auVar270._24_4_,
                                                  CONCAT420(fVar207 * pfVar29[5] + auVar270._20_4_,
                                                            CONCAT416(fVar263 * pfVar29[4] +
                                                                      auVar270._16_4_,
                                                                      CONCAT412(fVar262 * pfVar29[3]
                                                                                + auVar270._12_4_,
                                                                                CONCAT48(fVar261 * 
                                                  pfVar29[2] + auVar270._8_4_,
                                                  CONCAT44(fVar260 * pfVar29[1] + auVar270._4_4_,
                                                           fVar259 * *pfVar29 + auVar270._0_4_))))))
                                       ));
          auVar62 = ZEXT3264(CONCAT428(auVar62._28_4_ + auVar206._28_4_,
                                       CONCAT424(auVar62._24_4_ + auVar180._24_4_,
                                                 CONCAT420(auVar62._20_4_ + auVar180._20_4_,
                                                           CONCAT416(auVar62._16_4_ +
                                                                     auVar180._16_4_,
                                                                     CONCAT412(auVar62._12_4_ +
                                                                               auVar180._12_4_,
                                                                               CONCAT48(auVar62.
                                                  _8_4_ + auVar180._8_4_,
                                                  CONCAT44(auVar62._4_4_ + auVar180._4_4_,
                                                           auVar62._0_4_ + auVar180._0_4_))))))));
          pfVar29 = (float *)((long)pvVar12 + lVar43 + lVar44);
          auVar102 = ZEXT3264(CONCAT428(auVar102._28_4_ + pfVar31[7],
                                        CONCAT424(auVar102._24_4_ + fVar210 * pfVar29[6],
                                                  CONCAT420(auVar102._20_4_ + fVar207 * pfVar29[5],
                                                            CONCAT416(auVar102._16_4_ +
                                                                      fVar263 * pfVar29[4],
                                                                      CONCAT412(auVar102._12_4_ +
                                                                                fVar262 * pfVar29[3]
                                                                                ,CONCAT48(auVar102.
                                                  _8_4_ + fVar261 * pfVar29[2],
                                                  CONCAT44(auVar102._4_4_ + fVar260 * pfVar29[1],
                                                           auVar102._0_4_ + fVar259 * *pfVar29))))))
                                       ));
          lVar43 = lVar43 + 0x20;
          lVar42 = lVar42 + 8;
          auVar206 = ZEXT3264(auVar180._0_32_);
        }
        auVar112 = ZEXT816(0) << 0x40;
        auVar164 = ZEXT816(0) << 0x40;
        auVar235 = ZEXT816(0) << 0x40;
        auVar247 = ZEXT816(0) << 0x40;
        for (; iVar38 + 3 < iVar35; iVar38 = iVar38 + 4) {
          pfVar31 = (float *)((long)local_e8 + lVar43);
          fVar258 = *pfVar31;
          fVar259 = pfVar31[1];
          fVar260 = pfVar31[2];
          fVar261 = pfVar31[3];
          pfVar31 = (float *)((long)pvVar12 + lVar43 + lVar40);
          auVar269._0_4_ = auVar247._0_4_ + fVar258 * *pfVar31;
          auVar269._4_4_ = auVar247._4_4_ + fVar259 * pfVar31[1];
          auVar269._8_4_ = auVar247._8_4_ + fVar260 * pfVar31[2];
          auVar269._12_4_ = auVar247._12_4_ + fVar261 * pfVar31[3];
          pfVar31 = (float *)((long)pvVar12 + lVar43 + lVar39);
          pfVar29 = (float *)((long)pvVar12 + lVar43 + lVar34);
          auVar70._0_4_ = fVar258 * *pfVar31 + auVar112._0_4_;
          auVar70._4_4_ = fVar259 * pfVar31[1] + auVar112._4_4_;
          auVar70._8_4_ = fVar260 * pfVar31[2] + auVar112._8_4_;
          auVar70._12_4_ = fVar261 * pfVar31[3] + auVar112._12_4_;
          auVar126._0_4_ = fVar258 * *pfVar29 + auVar164._0_4_;
          auVar126._4_4_ = fVar259 * pfVar29[1] + auVar164._4_4_;
          auVar126._8_4_ = fVar260 * pfVar29[2] + auVar164._8_4_;
          auVar126._12_4_ = fVar261 * pfVar29[3] + auVar164._12_4_;
          pfVar31 = (float *)((long)pvVar12 + lVar43 + lVar44);
          auVar200._0_4_ = fVar258 * *pfVar31 + auVar235._0_4_;
          auVar200._4_4_ = fVar259 * pfVar31[1] + auVar235._4_4_;
          auVar200._8_4_ = fVar260 * pfVar31[2] + auVar235._8_4_;
          auVar200._12_4_ = fVar261 * pfVar31[3] + auVar235._12_4_;
          lVar43 = lVar43 + 0x10;
          lVar42 = lVar42 + 4;
          auVar112 = auVar70;
          auVar164 = auVar126;
          auVar235 = auVar200;
          auVar247 = auVar269;
        }
        for (; (int)lVar42 < iVar35; lVar42 = lVar42 + 1) {
          auVar69 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar12 + lVar42 * 4 + lVar40)),
                                  ZEXT416(*(uint *)((long)pvVar12 + lVar42 * 4 + lVar39)),0x10);
          auVar69 = vinsertps_avx(auVar69,ZEXT416(*(uint *)((long)pvVar12 + lVar42 * 4 + lVar34)),
                                  0x20);
          auVar69 = vinsertps_avx(auVar69,ZEXT416(*(uint *)((long)pvVar12 + lVar42 * 4 + lVar44)),
                                  0x30);
          fVar258 = local_e8[lVar42];
          fVar211 = fVar211 + auVar69._0_4_ * fVar258;
          fVar212 = fVar212 + auVar69._4_4_ * fVar258;
          fVar254 = fVar254 + auVar69._8_4_ * fVar258;
          fVar257 = fVar257 + auVar69._12_4_ * fVar258;
        }
        auVar56 = vhaddps_avx(auVar155._0_32_,auVar270._0_32_);
        auVar264 = vhaddps_avx(auVar62._0_32_,auVar102._0_32_);
        auVar56 = vhaddps_avx(auVar56,auVar264);
        auVar69 = vunpcklps_avx(auVar247,auVar112);
        auVar176 = vunpcklps_avx(auVar164,auVar235);
        auVar247 = vunpckhps_avx(auVar247,auVar112);
        auVar235 = vunpckhps_avx(auVar164,auVar235);
        in_ZMM2 = ZEXT1664(auVar235);
        auVar112 = vmovlhps_avx(auVar69,auVar176);
        auVar164 = vunpckhpd_avx(auVar69,auVar176);
        fVar258 = auVar164._0_4_ + auVar112._0_4_;
        fVar259 = auVar164._4_4_ + auVar112._4_4_;
        fVar260 = auVar164._8_4_ + auVar112._8_4_;
        fVar261 = auVar164._12_4_ + auVar112._12_4_;
        auVar206 = ZEXT1664(CONCAT412(fVar261,CONCAT48(fVar260,CONCAT44(fVar259,fVar258))));
        auVar112 = vmovlhps_avx(auVar247,auVar235);
        auVar164 = vunpckhpd_avx(auVar247,auVar235);
        auVar255._0_4_ =
             fVar211 + fVar258 + auVar112._0_4_ + auVar164._0_4_ + auVar56._0_4_ + auVar56._16_4_;
        auVar255._4_4_ =
             fVar212 + fVar259 + auVar112._4_4_ + auVar164._4_4_ + auVar56._4_4_ + auVar56._20_4_;
        auVar255._8_4_ =
             fVar254 + fVar260 + auVar112._8_4_ + auVar164._8_4_ + auVar56._8_4_ + auVar56._24_4_;
        auVar255._12_4_ =
             fVar257 + fVar261 + auVar112._12_4_ + auVar164._12_4_ + auVar56._12_4_ + auVar56._28_4_
        ;
        auVar79 = auVar255;
        if (5 < iVar26 - 1U) goto switchD_002c2eb2_caseD_1;
        auVar112 = auVar266._0_16_;
        auVar79 = vmaxps_avx(auVar255,auVar112);
        fVar211 = auVar267._0_4_;
        fVar212 = auVar267._4_4_;
        fVar254 = auVar267._8_4_;
        fVar257 = auVar267._12_4_;
        switch(iVar26) {
        case 2:
          auVar112 = vminps_avx(auVar255,auVar112);
          fVar211 = **(float **)(&this->field_0xe8 + (long)p_Var9);
          auVar127._0_4_ = fVar211 * auVar112._0_4_;
          auVar127._4_4_ = fVar211 * auVar112._4_4_;
          auVar127._8_4_ = fVar211 * auVar112._8_4_;
          auVar127._12_4_ = fVar211 * auVar112._12_4_;
          goto LAB_002c32ba;
        case 3:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar75._4_4_ = uVar7;
          auVar75._0_4_ = uVar7;
          auVar75._8_4_ = uVar7;
          auVar75._12_4_ = uVar7;
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
          auVar136._4_4_ = uVar7;
          auVar136._0_4_ = uVar7;
          auVar136._8_4_ = uVar7;
          auVar136._12_4_ = uVar7;
          in_ZMM2 = ZEXT1664(auVar136);
          auVar112 = vmaxps_avx(auVar255,auVar75);
          auVar79 = vminps_avx(auVar112,auVar136);
          break;
        case 4:
          uVar25 = CONCAT44(auVar255._4_4_,auVar255._0_4_);
          auVar76._0_8_ = uVar25 ^ 0x8000000080000000;
          auVar76._8_4_ = -auVar255._8_4_;
          auVar76._12_4_ = -auVar255._12_4_;
          auVar137._8_4_ = 0x42b0c0a5;
          auVar137._0_8_ = 0x42b0c0a542b0c0a5;
          auVar137._12_4_ = 0x42b0c0a5;
          auVar112 = vminps_avx(auVar76,auVar137);
          auVar138._8_4_ = 0xc2b0c0a5;
          auVar138._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar138._12_4_ = 0xc2b0c0a5;
          auVar235 = vmaxps_avx(auVar112,auVar138);
          auVar139._0_4_ = fVar211 + auVar235._0_4_ * 1.442695;
          auVar139._4_4_ = fVar212 + auVar235._4_4_ * 1.442695;
          auVar139._8_4_ = fVar254 + auVar235._8_4_ * 1.442695;
          auVar139._12_4_ = fVar257 + auVar235._12_4_ * 1.442695;
          auVar198._0_4_ = (int)auVar139._0_4_;
          auVar198._4_4_ = (int)auVar139._4_4_;
          auVar198._8_4_ = (int)auVar139._8_4_;
          auVar198._12_4_ = (int)auVar139._12_4_;
          auVar164 = vcvtdq2ps_avx(auVar198);
          auVar112 = vcmpps_avx(auVar139,auVar164,1);
          auVar208._8_4_ = 0x3f800000;
          auVar208._0_8_ = 0x3f8000003f800000;
          auVar208._12_4_ = 0x3f800000;
          auVar112 = vandps_avx(auVar112,auVar208);
          auVar112 = vsubps_avx(auVar164,auVar112);
          fVar258 = auVar235._0_4_ + auVar112._0_4_ * -0.6931472;
          fVar259 = auVar235._4_4_ + auVar112._4_4_ * -0.6931472;
          fVar260 = auVar235._8_4_ + auVar112._8_4_ * -0.6931472;
          fVar261 = auVar235._12_4_ + auVar112._12_4_ * -0.6931472;
          fVar211 = fVar211 + ((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 + 0.008333452) *
                                fVar258 + 0.041665796) * fVar258 + 0.16666666) * fVar258;
          fVar212 = fVar212 + ((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 + 0.008333452) *
                                fVar259 + 0.041665796) * fVar259 + 0.16666666) * fVar259;
          fVar254 = fVar254 + ((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) *
                                fVar260 + 0.041665796) * fVar260 + 0.16666666) * fVar260;
          fVar257 = fVar257 + ((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) *
                                fVar261 + 0.041665796) * fVar261 + 0.16666666) * fVar261;
          auVar206 = ZEXT1664(CONCAT412(fVar257,CONCAT48(fVar254,CONCAT44(fVar212,fVar211))));
          auVar140._0_4_ = (int)auVar112._0_4_;
          auVar140._4_4_ = (int)auVar112._4_4_;
          auVar140._8_4_ = (int)auVar112._8_4_;
          auVar140._12_4_ = (int)auVar112._12_4_;
          auVar112 = vpslld_avx(auVar140,0x17);
          auVar112 = vpaddd_avx(auVar112,auVar208);
          auVar77._0_4_ = (fVar258 + 1.0 + fVar258 * fVar258 * fVar211) * auVar112._0_4_ + 1.0;
          auVar77._4_4_ = (fVar259 + 1.0 + fVar259 * fVar259 * fVar212) * auVar112._4_4_ + 1.0;
          auVar77._8_4_ = (fVar260 + 1.0 + fVar260 * fVar260 * fVar254) * auVar112._8_4_ + 1.0;
          auVar77._12_4_ = (fVar261 + 1.0 + fVar261 * fVar261 * fVar257) * auVar112._12_4_ + 1.0;
          auVar127 = vrcpps_avx(auVar77);
          auVar78._0_4_ = auVar77._0_4_ * auVar127._0_4_;
          auVar78._4_4_ = auVar77._4_4_ * auVar127._4_4_;
          auVar78._8_4_ = auVar77._8_4_ * auVar127._8_4_;
          auVar78._12_4_ = auVar77._12_4_ * auVar127._12_4_;
          auVar112 = vsubps_avx(auVar208,auVar78);
          auVar79._0_4_ = auVar127._0_4_ * auVar112._0_4_;
          auVar79._4_4_ = auVar127._4_4_ * auVar112._4_4_;
          auVar79._8_4_ = auVar127._8_4_ * auVar112._8_4_;
          auVar79._12_4_ = auVar127._12_4_ * auVar112._12_4_;
LAB_002c32ba:
          in_ZMM2 = ZEXT1664(auVar127);
          auVar80._0_4_ = auVar127._0_4_ + auVar79._0_4_;
          auVar80._4_4_ = auVar127._4_4_ + auVar79._4_4_;
          auVar80._8_4_ = auVar127._8_4_ + auVar79._8_4_;
          auVar80._12_4_ = auVar127._12_4_ + auVar79._12_4_;
          auVar79 = auVar80;
          break;
        case 5:
          auVar236._8_4_ = 0x42b0c0a5;
          auVar236._0_8_ = 0x42b0c0a542b0c0a5;
          auVar236._12_4_ = 0x42b0c0a5;
          auVar112 = vminps_avx(auVar255,auVar236);
          auVar252._8_4_ = 0xc2b0c0a5;
          auVar252._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar252._12_4_ = 0xc2b0c0a5;
          auVar235 = vmaxps_avx(auVar252,auVar112);
          auVar128._0_4_ = fVar211 + auVar235._0_4_ * 1.442695;
          auVar128._4_4_ = fVar212 + auVar235._4_4_ * 1.442695;
          auVar128._8_4_ = fVar254 + auVar235._8_4_ * 1.442695;
          auVar128._12_4_ = fVar257 + auVar235._12_4_ * 1.442695;
          auVar193._0_4_ = (int)auVar128._0_4_;
          auVar193._4_4_ = (int)auVar128._4_4_;
          auVar193._8_4_ = (int)auVar128._8_4_;
          auVar193._12_4_ = (int)auVar128._12_4_;
          auVar164 = vcvtdq2ps_avx(auVar193);
          auVar112 = vcmpps_avx(auVar128,auVar164,1);
          auVar222._8_4_ = 0x3f800000;
          auVar222._0_8_ = 0x3f8000003f800000;
          auVar222._12_4_ = 0x3f800000;
          auVar112 = vandps_avx(auVar112,auVar222);
          auVar112 = vsubps_avx(auVar164,auVar112);
          auVar194._0_4_ = auVar112._0_4_ * 0.6931472;
          auVar194._4_4_ = auVar112._4_4_ * 0.6931472;
          auVar194._8_4_ = auVar112._8_4_ * 0.6931472;
          auVar194._12_4_ = auVar112._12_4_ * 0.6931472;
          auVar164 = vsubps_avx(auVar235,auVar194);
          fVar258 = auVar164._0_4_;
          fVar259 = auVar164._4_4_;
          fVar260 = auVar164._8_4_;
          fVar261 = auVar164._12_4_;
          auVar129._0_4_ = (int)auVar112._0_4_;
          auVar129._4_4_ = (int)auVar112._4_4_;
          auVar129._8_4_ = (int)auVar112._8_4_;
          auVar129._12_4_ = (int)auVar112._12_4_;
          auVar112 = vpslld_avx(auVar129,0x17);
          auVar112 = vpaddd_avx(auVar112,auVar222);
          auVar71._0_4_ =
               (fVar258 + 1.0 +
               fVar258 * fVar258 *
               (((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 + 0.008333452) * fVar258 +
                 0.041665796) * fVar258 + 0.16666666) * fVar258 + fVar211)) * auVar112._0_4_ + 1.0;
          auVar71._4_4_ =
               (fVar259 + 1.0 +
               fVar259 * fVar259 *
               (((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 + 0.008333452) * fVar259 +
                 0.041665796) * fVar259 + 0.16666666) * fVar259 + fVar212)) * auVar112._4_4_ + 1.0;
          auVar71._8_4_ =
               (fVar260 + 1.0 +
               fVar260 * fVar260 *
               (((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260 +
                 0.041665796) * fVar260 + 0.16666666) * fVar260 + fVar254)) * auVar112._8_4_ + 1.0;
          auVar71._12_4_ =
               (fVar261 + 1.0 +
               fVar261 * fVar261 *
               (((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261 +
                 0.041665796) * fVar261 + 0.16666666) * fVar261 + fVar257)) * auVar112._12_4_ + 1.0;
          auVar130._8_4_ = 0x800000;
          auVar130._0_8_ = 0x80000000800000;
          auVar130._12_4_ = 0x800000;
          auVar112 = vmaxps_avx(auVar71,auVar130);
          auVar164 = vpsrld_avx(auVar112,0x17);
          auVar201._8_4_ = 0xffffff82;
          auVar201._0_8_ = 0xffffff82ffffff82;
          auVar201._12_4_ = 0xffffff82;
          auVar164 = vpaddd_avx(auVar164,auVar201);
          auVar202._8_4_ = 0x807fffff;
          auVar202._0_8_ = 0x807fffff807fffff;
          auVar202._12_4_ = 0x807fffff;
          auVar112 = vandps_avx(auVar112,auVar202);
          auVar247 = vorps_avx(auVar112,auVar267._0_16_);
          auVar235 = vcvtdq2ps_avx(auVar164);
          auVar203._8_4_ = 0x3f3504f3;
          auVar203._0_8_ = 0x3f3504f33f3504f3;
          auVar203._12_4_ = 0x3f3504f3;
          auVar164 = vcmpps_avx(auVar247,auVar203,1);
          auVar112 = vandps_avx(auVar164,auVar247);
          fVar258 = auVar247._0_4_ + -1.0 + auVar112._0_4_;
          fVar259 = auVar247._4_4_ + -1.0 + auVar112._4_4_;
          fVar260 = auVar247._8_4_ + -1.0 + auVar112._8_4_;
          fVar261 = auVar247._12_4_ + -1.0 + auVar112._12_4_;
          auVar112 = vandps_avx(auVar164,auVar222);
          auVar164 = vsubps_avx(auVar235,auVar112);
          auVar112 = vcmpps_avx(auVar71,_DAT_004ed070,2);
          auVar131._0_4_ =
               (auVar164._0_4_ * 0.6931472 + fVar258 +
               fVar258 * fVar258 *
               (((((((((fVar258 * 0.070376836 + -0.1151461) * fVar258 + 0.116769984) * fVar258 +
                     -0.12420141) * fVar258 + 0.14249323) * fVar258 + -0.16668057) * fVar258 +
                  0.20000714) * fVar258 + -0.24999994) * fVar258 + 0.3333333) * fVar258 + -0.5)) *
               -2.0;
          auVar131._4_4_ =
               (auVar164._4_4_ * 0.6931472 + fVar259 +
               fVar259 * fVar259 *
               (((((((((fVar259 * 0.070376836 + -0.1151461) * fVar259 + 0.116769984) * fVar259 +
                     -0.12420141) * fVar259 + 0.14249323) * fVar259 + -0.16668057) * fVar259 +
                  0.20000714) * fVar259 + -0.24999994) * fVar259 + 0.3333333) * fVar259 + -0.5)) *
               -2.0;
          auVar131._8_4_ =
               (auVar164._8_4_ * 0.6931472 + fVar260 +
               fVar260 * fVar260 *
               (((((((((fVar260 * 0.070376836 + -0.1151461) * fVar260 + 0.116769984) * fVar260 +
                     -0.12420141) * fVar260 + 0.14249323) * fVar260 + -0.16668057) * fVar260 +
                  0.20000714) * fVar260 + -0.24999994) * fVar260 + 0.3333333) * fVar260 + -0.5)) *
               -2.0;
          auVar131._12_4_ =
               (auVar164._12_4_ * 0.6931472 + fVar261 +
               fVar261 * fVar261 *
               (((((((((fVar261 * 0.070376836 + -0.1151461) * fVar261 + 0.116769984) * fVar261 +
                     -0.12420141) * fVar261 + 0.14249323) * fVar261 + -0.16668057) * fVar261 +
                  0.20000714) * fVar261 + -0.24999994) * fVar261 + 0.3333333) * fVar261 + -0.5)) *
               -2.0;
          auVar195._8_4_ = 0x7fffffff;
          auVar195._0_8_ = 0x7fffffff7fffffff;
          auVar195._12_4_ = 0x7fffffff;
          auVar112 = vblendvps_avx(auVar131,auVar195,auVar112);
          auVar132._8_4_ = 0x42b0c0a5;
          auVar132._0_8_ = 0x42b0c0a542b0c0a5;
          auVar132._12_4_ = 0x42b0c0a5;
          auVar112 = vminps_avx(auVar112,auVar132);
          auVar235 = vmaxps_avx(auVar252,auVar112);
          auVar133._0_4_ = auVar235._0_4_ * 1.442695 + fVar211;
          auVar133._4_4_ = auVar235._4_4_ * 1.442695 + fVar212;
          auVar133._8_4_ = auVar235._8_4_ * 1.442695 + fVar254;
          auVar133._12_4_ = auVar235._12_4_ * 1.442695 + fVar257;
          auVar196._0_4_ = (int)auVar133._0_4_;
          auVar196._4_4_ = (int)auVar133._4_4_;
          auVar196._8_4_ = (int)auVar133._8_4_;
          auVar196._12_4_ = (int)auVar133._12_4_;
          auVar164 = vcvtdq2ps_avx(auVar196);
          auVar112 = vcmpps_avx(auVar133,auVar164,1);
          auVar112 = vandps_avx(auVar112,auVar222);
          auVar112 = vsubps_avx(auVar164,auVar112);
          auVar197._0_4_ = auVar112._0_4_ * 0.6931472;
          auVar197._4_4_ = auVar112._4_4_ * 0.6931472;
          auVar197._8_4_ = auVar112._8_4_ * 0.6931472;
          auVar197._12_4_ = auVar112._12_4_ * 0.6931472;
          auVar164 = vsubps_avx(auVar235,auVar197);
          fVar258 = auVar164._0_4_;
          fVar259 = auVar164._4_4_;
          fVar260 = auVar164._8_4_;
          fVar261 = auVar164._12_4_;
          auVar267 = ZEXT1664(auVar267._0_16_);
          auVar266 = ZEXT864(0) << 0x20;
          auVar134._0_4_ = (int)auVar112._0_4_;
          auVar134._4_4_ = (int)auVar112._4_4_;
          auVar134._8_4_ = (int)auVar112._8_4_;
          auVar134._12_4_ = (int)auVar112._12_4_;
          auVar112 = vpslld_avx(auVar134,0x17);
          auVar112 = vpaddd_avx(auVar112,auVar222);
          auVar72._0_4_ =
               (fVar258 + 1.0 +
               fVar258 * fVar258 *
               (fVar211 +
               ((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 + 0.008333452) * fVar258 +
                0.041665796) * fVar258 + 0.16666666) * fVar258)) * auVar112._0_4_ + 1.0;
          auVar72._4_4_ =
               (fVar259 + 1.0 +
               fVar259 * fVar259 *
               (fVar212 +
               ((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 + 0.008333452) * fVar259 +
                0.041665796) * fVar259 + 0.16666666) * fVar259)) * auVar112._4_4_ + 1.0;
          auVar72._8_4_ =
               (fVar260 + 1.0 +
               fVar260 * fVar260 *
               (fVar254 +
               ((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260 +
                0.041665796) * fVar260 + 0.16666666) * fVar260)) * auVar112._8_4_ + 1.0;
          auVar72._12_4_ =
               (fVar261 + 1.0 +
               fVar261 * fVar261 *
               (fVar257 +
               ((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261 +
                0.041665796) * fVar261 + 0.16666666) * fVar261)) * auVar112._12_4_ + 1.0;
          auVar112 = vrcpps_avx(auVar72);
          fVar211 = auVar112._0_4_;
          fVar212 = auVar112._4_4_;
          fVar254 = auVar112._8_4_;
          fVar257 = auVar112._12_4_;
          auVar73._0_4_ = auVar72._0_4_ * (fVar211 + fVar211);
          auVar73._4_4_ = auVar72._4_4_ * (fVar212 + fVar212);
          auVar73._8_4_ = auVar72._8_4_ * (fVar254 + fVar254);
          auVar73._12_4_ = auVar72._12_4_ * (fVar257 + fVar257);
          auVar204._8_4_ = 0x40000000;
          auVar204._0_8_ = 0x4000000040000000;
          auVar204._12_4_ = 0x40000000;
          auVar206 = ZEXT1664(auVar204);
          auVar112 = vsubps_avx(auVar204,auVar73);
          auVar135._0_4_ = fVar211 + fVar211 + -1.0;
          auVar135._4_4_ = fVar212 + fVar212 + -1.0;
          auVar135._8_4_ = fVar254 + fVar254 + -1.0;
          auVar135._12_4_ = fVar257 + fVar257 + -1.0;
          auVar74._0_4_ = auVar135._0_4_ + fVar211 * auVar112._0_4_;
          auVar74._4_4_ = auVar135._4_4_ + fVar212 * auVar112._4_4_;
          auVar74._8_4_ = auVar135._8_4_ + fVar254 * auVar112._8_4_;
          auVar74._12_4_ = auVar135._12_4_ + fVar257 * auVar112._12_4_;
          goto LAB_002c32f1;
        case 6:
          fVar211 = **(float **)(&this->field_0xe8 + (long)p_Var9);
          fVar212 = (*(float **)(&this->field_0xe8 + (long)p_Var9))[1];
          auVar81._0_4_ = auVar255._0_4_ * fVar211 + fVar212;
          auVar81._4_4_ = auVar255._4_4_ * fVar211 + fVar212;
          auVar81._8_4_ = auVar255._8_4_ * fVar211 + fVar212;
          auVar81._12_4_ = auVar255._12_4_ * fVar211 + fVar212;
          auVar112 = vmaxps_avx(auVar81,auVar112);
          auVar135._8_4_ = 1.0;
          auVar135._0_8_ = 0x3f8000003f800000;
          auVar135._12_4_ = 1.0;
          auVar74 = vminps_avx(auVar112,auVar135);
LAB_002c32f1:
          in_ZMM2 = ZEXT1664(auVar135);
          auVar79._0_4_ = auVar255._0_4_ * auVar74._0_4_;
          auVar79._4_4_ = auVar255._4_4_ * auVar74._4_4_;
          auVar79._8_4_ = auVar255._8_4_ * auVar74._8_4_;
          auVar79._12_4_ = auVar255._12_4_ * auVar74._12_4_;
        }
switchD_002c2eb2_caseD_1:
        *(undefined1 (*) [16])((long)top_blob->data + lVar32 * 4) = auVar79;
        lVar40 = lVar40 + lVar36;
        lVar39 = lVar39 + lVar36;
        lVar34 = lVar34 + lVar36;
        lVar44 = lVar44 + lVar36;
      }
      pvVar12 = (this->weight_data_tm).data;
      pfVar31 = *(float **)(&this->field_0xe8 + (long)p_Var9);
      pvVar14 = top_blob->data;
      local_148 = 0;
      for (lVar34 = (long)(int)((int)uVar30 + uVar27 * 4); lVar34 < (int)uVar8; lVar34 = lVar34 + 1)
      {
        if (lVar11 == 0) {
          fVar211 = 0.0;
        }
        else {
          fVar211 = *(float *)(lVar11 + lVar34 * 4);
        }
        pfVar29 = (float *)((long)pvVar12 + lVar34 * lVar37 * 4);
        fVar212 = 0.0;
        fVar254 = 0.0;
        fVar257 = 0.0;
        fVar258 = 0.0;
        fVar259 = 0.0;
        fVar260 = 0.0;
        fVar261 = 0.0;
        fVar262 = 0.0;
        pfVar33 = pfVar41;
        for (iVar38 = 0; iVar38 + 7 < iVar35; iVar38 = iVar38 + 8) {
          fVar257 = *pfVar29 * *pfVar33 + fVar257;
          fVar258 = pfVar29[1] * pfVar33[1] + fVar258;
          fVar212 = pfVar29[2] * pfVar33[2] + fVar212;
          fVar254 = pfVar29[3] * pfVar33[3] + fVar254;
          fVar259 = pfVar29[4] * pfVar33[4] + fVar259;
          fVar260 = pfVar29[5] * pfVar33[5] + fVar260;
          fVar261 = pfVar29[6] * pfVar33[6] + fVar261;
          fVar262 = pfVar29[7] + fVar262;
          pfVar33 = pfVar33 + 8;
          pfVar29 = pfVar29 + 8;
        }
        fVar263 = 0.0;
        fVar207 = 0.0;
        fVar210 = 0.0;
        fVar213 = 0.0;
        for (; iVar38 + 3 < iVar35; iVar38 = iVar38 + 4) {
          fVar263 = *pfVar29 * *pfVar33 + fVar263;
          fVar207 = pfVar29[1] * pfVar33[1] + fVar207;
          fVar210 = pfVar29[2] * pfVar33[2] + fVar210;
          fVar213 = pfVar29[3] * pfVar33[3] + fVar213;
          pfVar33 = pfVar33 + 4;
          pfVar29 = pfVar29 + 4;
        }
        lVar36 = 0;
        for (; iVar38 < iVar35; iVar38 = iVar38 + 1) {
          fVar211 = *(float *)((long)pfVar29 + lVar36) * *(float *)((long)pfVar33 + lVar36) +
                    fVar211;
          lVar36 = lVar36 + 4;
        }
        auVar82._0_4_ = fVar257 + fVar263 + fVar259;
        auVar82._4_4_ = fVar258 + fVar207 + fVar260;
        auVar82._8_4_ = fVar212 + fVar210 + fVar261;
        auVar82._12_4_ = fVar254 + fVar213 + fVar262;
        auVar112 = vhaddps_avx(auVar82,auVar82);
        auVar112 = vhaddps_avx(auVar112,auVar112);
        fVar211 = auVar112._0_4_ + fVar211;
        auVar112 = ZEXT416((uint)fVar211);
        fVar212 = fVar211;
        switch(iVar26) {
        case 1:
          auVar112 = vmaxss_avx(auVar112,ZEXT416(0));
          fVar212 = auVar112._0_4_;
          break;
        case 2:
          auVar112 = vcmpss_avx(ZEXT816(0) << 0x40,auVar112,1);
          auVar142._8_4_ = 0x3f800000;
          auVar142._0_8_ = 0x3f8000003f800000;
          auVar142._12_4_ = 0x3f800000;
          auVar112 = vblendvps_avx(ZEXT416((uint)*pfVar31),auVar142,auVar112);
          fVar212 = auVar112._0_4_;
LAB_002c3520:
          fVar212 = fVar212 * fVar211;
          break;
        case 3:
          auVar112 = vmaxss_avx(auVar112,ZEXT416((uint)*pfVar31));
          fVar212 = auVar112._0_4_;
          if (pfVar31[1] < auVar112._0_4_) {
            fVar212 = pfVar31[1];
          }
          break;
        case 4:
          auVar112 = vminss_avx(auVar112,ZEXT416(0x42b0c0a5));
          auVar83._0_8_ = auVar112._0_8_ ^ 0x8000000080000000;
          auVar83._8_4_ = auVar112._8_4_ ^ 0x80000000;
          auVar83._12_4_ = auVar112._12_4_ ^ 0x80000000;
          auVar112 = vcmpss_avx(auVar112,ZEXT416(0xc2b0c0a5),1);
          auVar141._8_4_ = 0x42b0c0a5;
          auVar141._0_8_ = 0x42b0c0a542b0c0a5;
          auVar141._12_4_ = 0x42b0c0a5;
          auVar112 = vblendvps_avx(auVar83,auVar141,auVar112);
          fVar211 = expf(auVar112._0_4_);
          fVar212 = 1.0 / (fVar211 + 1.0);
          break;
        case 5:
          fVar212 = expf(fVar211);
          fVar212 = logf(fVar212 + 1.0);
          fVar212 = tanhf(fVar212);
          fVar212 = fVar212 * fVar211;
          break;
        case 6:
          fVar254 = *pfVar31;
          fVar257 = -pfVar31[1] / fVar254;
          fVar212 = 0.0;
          if ((fVar257 <= fVar211) && (fVar212 = fVar211, fVar211 <= fVar257 + 1.0 / fVar254)) {
            fVar212 = fVar254 * fVar211 + pfVar31[1];
            goto LAB_002c3520;
          }
        }
        *(float *)((long)pvVar14 + lVar34 * 4) = fVar212;
      }
    }
    else if (iVar38 == 4) {
      local_148 = 0;
      uVar30 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar30 = 0;
      }
      auVar206 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar266 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar45._8_4_ = 0x3f800000;
      auVar45._0_8_ = 0x3f8000003f800000;
      auVar45._12_4_ = 0x3f800000;
      for (uVar28 = 0; uVar28 != uVar30; uVar28 = uVar28 + 1) {
        if (lVar11 == 0) {
          fVar211 = 0.0;
          fVar212 = 0.0;
          fVar254 = 0.0;
          fVar257 = 0.0;
        }
        else {
          pfVar41 = (float *)(lVar11 + uVar28 * 0x10);
          fVar211 = *pfVar41;
          fVar212 = pfVar41[1];
          fVar254 = pfVar41[2];
          fVar257 = pfVar41[3];
        }
        pvVar12 = (this->weight_data_tm).data;
        sVar13 = (this->weight_data_tm).elemsize;
        lVar34 = (long)(this->weight_data_tm).w;
        pfVar31 = (float *)(uVar28 * lVar34 * sVar13 + (long)pvVar12);
        lVar36 = 0;
        fVar260 = 0.0;
        fVar261 = 0.0;
        fVar105 = 0.0;
        fVar157 = 0.0;
        fVar158 = 0.0;
        fVar182 = 0.0;
        fVar183 = 0.0;
        lVar37 = 0;
        fVar207 = 0.0;
        fVar210 = 0.0;
        fVar273 = 0.0;
        fVar63 = 0.0;
        fVar103 = 0.0;
        fVar106 = 0.0;
        fVar107 = 0.0;
        fVar262 = 0.0;
        fVar263 = 0.0;
        fVar227 = 0.0;
        fVar228 = 0.0;
        fVar239 = 0.0;
        fVar240 = 0.0;
        fVar272 = 0.0;
        fVar258 = 0.0;
        fVar259 = 0.0;
        fVar213 = 0.0;
        fVar214 = 0.0;
        fVar215 = 0.0;
        fVar216 = 0.0;
        fVar104 = 0.0;
        pfVar41 = local_e8;
        for (iVar38 = 0; iVar38 + 7 < iVar35; iVar38 = iVar38 + 8) {
          fVar108 = *pfVar41;
          fVar109 = pfVar41[1];
          fVar110 = pfVar41[2];
          fVar156 = pfVar41[4];
          fVar159 = pfVar41[6];
          fVar213 = fVar108 * *pfVar31 + fVar213;
          fVar214 = fVar108 * pfVar31[1] + fVar214;
          fVar258 = fVar108 * pfVar31[2] + fVar258;
          fVar259 = fVar108 * pfVar31[3] + fVar259;
          fVar215 = fVar109 * pfVar31[4] + fVar215;
          fVar216 = fVar109 * pfVar31[6] + fVar216;
          fVar104 = fVar109 + fVar104;
          fVar227 = fVar227 + fVar110 * pfVar31[8];
          fVar228 = fVar228 + fVar110 * pfVar31[9];
          fVar262 = fVar262 + fVar110 * pfVar31[10];
          fVar263 = fVar263 + fVar110 * pfVar31[0xb];
          fVar239 = fVar239 + pfVar41[3] * pfVar31[0xc];
          fVar240 = fVar240 + pfVar41[3] * pfVar31[0xe];
          fVar272 = fVar272 + fVar109;
          fVar273 = fVar273 + fVar156 * pfVar31[0x10];
          fVar63 = fVar63 + fVar156 * pfVar31[0x11];
          fVar207 = fVar207 + fVar156 * pfVar31[0x12];
          fVar210 = fVar210 + fVar156 * pfVar31[0x13];
          fVar103 = fVar103 + pfVar41[5] * pfVar31[0x14];
          fVar106 = fVar106 + pfVar41[5] * pfVar31[0x16];
          fVar107 = fVar107 + fVar109;
          fVar105 = fVar159 * pfVar31[0x18] + fVar105;
          fVar157 = fVar159 * pfVar31[0x19] + fVar157;
          fVar260 = fVar159 * pfVar31[0x1a] + fVar260;
          fVar261 = fVar159 * pfVar31[0x1b] + fVar261;
          fVar158 = pfVar41[7] * pfVar31[0x1c] + fVar158;
          fVar182 = pfVar41[7] * pfVar31[0x1e] + fVar182;
          fVar183 = fVar109 + fVar183;
          pfVar41 = pfVar41 + 8;
          pfVar31 = pfVar31 + 0x20;
          lVar37 = lVar37 + 0x20;
          lVar36 = lVar36 + 8;
        }
        lVar34 = sVar13 * uVar28 * lVar34;
        for (; iVar38 + 3 < iVar35; iVar38 = iVar38 + 4) {
          fVar108 = *(float *)((long)local_e8 + lVar37 + 4);
          fVar109 = *(float *)((long)local_e8 + lVar37);
          fVar110 = *(float *)((long)local_e8 + lVar37 + 0xc);
          fVar156 = *(float *)((long)local_e8 + lVar37 + 8);
          pfVar41 = (float *)((long)pvVar12 + lVar37 * 4 + lVar34);
          fVar213 = fVar109 * *pfVar41 + fVar213;
          fVar214 = fVar109 * pfVar41[1] + fVar214;
          fVar258 = fVar109 * pfVar41[2] + fVar258;
          fVar259 = fVar109 * pfVar41[3] + fVar259;
          fVar215 = fVar108 * pfVar41[4] + fVar215;
          fVar216 = fVar108 * pfVar41[6] + fVar216;
          fVar104 = fVar108 + fVar104;
          pfVar41 = (float *)((long)pvVar12 + lVar37 * 4 + lVar34 + 0x20);
          fVar227 = fVar227 + fVar156 * *pfVar41;
          fVar228 = fVar228 + fVar156 * pfVar41[1];
          fVar262 = fVar262 + fVar156 * pfVar41[2];
          fVar263 = fVar263 + fVar156 * pfVar41[3];
          fVar239 = fVar239 + fVar110 * pfVar41[4];
          fVar240 = fVar240 + fVar110 * pfVar41[6];
          fVar272 = fVar272 + fVar108;
          pfVar31 = pfVar31 + 0x10;
          lVar37 = lVar37 + 0x10;
          lVar36 = lVar36 + 4;
        }
        for (; (int)lVar36 < iVar35; lVar36 = lVar36 + 1) {
          fVar108 = local_e8[lVar36];
          fVar211 = fVar108 * *pfVar31 + fVar211;
          fVar212 = fVar108 * pfVar31[1] + fVar212;
          fVar254 = fVar108 * pfVar31[2] + fVar254;
          fVar257 = fVar108 * pfVar31[3] + fVar257;
          pfVar31 = pfVar31 + 4;
        }
        fVar214 = fVar63 + fVar157 + fVar228 + fVar214;
        auVar65._0_4_ =
             fVar103 + fVar158 + fVar239 + fVar215 + fVar273 + fVar105 + fVar227 + fVar213 + fVar211
        ;
        auVar65._4_4_ = fVar214 + fVar214 + fVar212;
        auVar65._8_4_ =
             fVar106 + fVar182 + fVar240 + fVar216 + fVar207 + fVar260 + fVar262 + fVar258 + fVar254
        ;
        auVar65._12_4_ =
             fVar107 + fVar183 + fVar272 + fVar104 + fVar210 + fVar261 + fVar263 + fVar259 + fVar257
        ;
        auVar124 = auVar65;
        if (5 < iVar26 - 1U) goto switchD_002c20bb_caseD_1;
        auVar112 = auVar206._0_16_;
        auVar124 = vmaxps_avx(auVar65,auVar112);
        fVar211 = auVar266._0_4_;
        fVar212 = auVar266._4_4_;
        fVar254 = auVar266._8_4_;
        fVar257 = auVar266._12_4_;
        switch(iVar26) {
        case 2:
          auVar112 = vminps_avx(auVar65,auVar112);
          fVar211 = **(float **)(&this->field_0xe8 + (long)p_Var9);
          auVar114._0_4_ = fVar211 * auVar112._0_4_ + auVar124._0_4_;
          auVar114._4_4_ = fVar211 * auVar112._4_4_ + auVar124._4_4_;
          auVar114._8_4_ = fVar211 * auVar112._8_4_ + auVar124._8_4_;
          auVar114._12_4_ = fVar211 * auVar112._12_4_ + auVar124._12_4_;
          auVar124 = auVar114;
          break;
        case 3:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar119._4_4_ = uVar7;
          auVar119._0_4_ = uVar7;
          auVar119._8_4_ = uVar7;
          auVar119._12_4_ = uVar7;
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
          auVar174._4_4_ = uVar7;
          auVar174._0_4_ = uVar7;
          auVar174._8_4_ = uVar7;
          auVar174._12_4_ = uVar7;
          auVar112 = vmaxps_avx(auVar65,auVar119);
          auVar124 = vminps_avx(auVar112,auVar174);
          break;
        case 4:
          uVar25 = CONCAT44(auVar65._4_4_,auVar65._0_4_);
          auVar66._0_8_ = uVar25 ^ 0x8000000080000000;
          auVar66._8_4_ = -auVar65._8_4_;
          auVar66._12_4_ = -auVar65._12_4_;
          auVar120._8_4_ = 0x42b0c0a5;
          auVar120._0_8_ = 0x42b0c0a542b0c0a5;
          auVar120._12_4_ = 0x42b0c0a5;
          auVar112 = vminps_avx(auVar66,auVar120);
          auVar121._8_4_ = 0xc2b0c0a5;
          auVar121._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar121._12_4_ = 0xc2b0c0a5;
          auVar235 = vmaxps_avx(auVar112,auVar121);
          auVar122._0_4_ = fVar211 + auVar235._0_4_ * 1.442695;
          auVar122._4_4_ = fVar212 + auVar235._4_4_ * 1.442695;
          auVar122._8_4_ = fVar254 + auVar235._8_4_ * 1.442695;
          auVar122._12_4_ = fVar257 + auVar235._12_4_ * 1.442695;
          auVar175._0_4_ = (int)auVar122._0_4_;
          auVar175._4_4_ = (int)auVar122._4_4_;
          auVar175._8_4_ = (int)auVar122._8_4_;
          auVar175._12_4_ = (int)auVar122._12_4_;
          auVar164 = vcvtdq2ps_avx(auVar175);
          auVar112 = vcmpps_avx(auVar122,auVar164,1);
          auVar112 = vandps_avx(auVar112,auVar45);
          auVar112 = vsubps_avx(auVar164,auVar112);
          fVar258 = auVar235._0_4_ + auVar112._0_4_ * -0.6931472;
          fVar259 = auVar235._4_4_ + auVar112._4_4_ * -0.6931472;
          fVar260 = auVar235._8_4_ + auVar112._8_4_ * -0.6931472;
          fVar261 = auVar235._12_4_ + auVar112._12_4_ * -0.6931472;
          auVar123._0_4_ = (int)auVar112._0_4_;
          auVar123._4_4_ = (int)auVar112._4_4_;
          auVar123._8_4_ = (int)auVar112._8_4_;
          auVar123._12_4_ = (int)auVar112._12_4_;
          auVar112 = vpslld_avx(auVar123,0x17);
          auVar112 = vpaddd_avx(auVar112,auVar45);
          auVar67._0_4_ =
               (fVar258 + 1.0 +
               fVar258 * fVar258 *
               (fVar211 +
               ((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 + 0.008333452) * fVar258 +
                0.041665796) * fVar258 + 0.16666666) * fVar258)) * auVar112._0_4_ + 1.0;
          auVar67._4_4_ =
               (fVar259 + 1.0 +
               fVar259 * fVar259 *
               (fVar212 +
               ((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 + 0.008333452) * fVar259 +
                0.041665796) * fVar259 + 0.16666666) * fVar259)) * auVar112._4_4_ + 1.0;
          auVar67._8_4_ =
               (fVar260 + 1.0 +
               fVar260 * fVar260 *
               (fVar254 +
               ((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260 +
                0.041665796) * fVar260 + 0.16666666) * fVar260)) * auVar112._8_4_ + 1.0;
          auVar67._12_4_ =
               (fVar261 + 1.0 +
               fVar261 * fVar261 *
               (fVar257 +
               ((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261 +
                0.041665796) * fVar261 + 0.16666666) * fVar261)) * auVar112._12_4_ + 1.0;
          auVar112 = vrcpps_avx(auVar67);
          fVar211 = auVar112._0_4_;
          auVar68._0_4_ = auVar67._0_4_ * fVar211;
          fVar212 = auVar112._4_4_;
          auVar68._4_4_ = auVar67._4_4_ * fVar212;
          fVar254 = auVar112._8_4_;
          auVar68._8_4_ = auVar67._8_4_ * fVar254;
          fVar257 = auVar112._12_4_;
          auVar68._12_4_ = auVar67._12_4_ * fVar257;
          auVar112 = vsubps_avx(auVar45,auVar68);
          auVar124._0_4_ = fVar211 + fVar211 * auVar112._0_4_;
          auVar124._4_4_ = fVar212 + fVar212 * auVar112._4_4_;
          auVar124._8_4_ = fVar254 + fVar254 * auVar112._8_4_;
          auVar124._12_4_ = fVar257 + fVar257 * auVar112._12_4_;
          break;
        case 5:
          auVar246._8_4_ = 0x42b0c0a5;
          auVar246._0_8_ = 0x42b0c0a542b0c0a5;
          auVar246._12_4_ = 0x42b0c0a5;
          auVar112 = vminps_avx(auVar246,auVar65);
          auVar249._8_4_ = 0xc2b0c0a5;
          auVar249._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar249._12_4_ = 0xc2b0c0a5;
          auVar235 = vmaxps_avx(auVar249,auVar112);
          auVar166._0_4_ = fVar211 + auVar235._0_4_ * 1.442695;
          auVar166._4_4_ = fVar212 + auVar235._4_4_ * 1.442695;
          auVar166._8_4_ = fVar254 + auVar235._8_4_ * 1.442695;
          auVar166._12_4_ = fVar257 + auVar235._12_4_ * 1.442695;
          auVar188._0_4_ = (int)auVar166._0_4_;
          auVar188._4_4_ = (int)auVar166._4_4_;
          auVar188._8_4_ = (int)auVar166._8_4_;
          auVar188._12_4_ = (int)auVar166._12_4_;
          auVar164 = vcvtdq2ps_avx(auVar188);
          auVar112 = vcmpps_avx(auVar166,auVar164,1);
          auVar112 = vandps_avx(auVar112,auVar45);
          auVar112 = vsubps_avx(auVar164,auVar112);
          auVar189._0_4_ = auVar112._0_4_ * 0.6931472;
          auVar189._4_4_ = auVar112._4_4_ * 0.6931472;
          auVar189._8_4_ = auVar112._8_4_ * 0.6931472;
          auVar189._12_4_ = auVar112._12_4_ * 0.6931472;
          auVar164 = vsubps_avx(auVar235,auVar189);
          fVar258 = auVar164._0_4_;
          fVar259 = auVar164._4_4_;
          fVar260 = auVar164._8_4_;
          fVar261 = auVar164._12_4_;
          auVar167._0_4_ = (int)auVar112._0_4_;
          auVar167._4_4_ = (int)auVar112._4_4_;
          auVar167._8_4_ = (int)auVar112._8_4_;
          auVar167._12_4_ = (int)auVar112._12_4_;
          auVar112 = vpslld_avx(auVar167,0x17);
          auVar112 = vpaddd_avx(auVar112,auVar45);
          auVar115._0_4_ =
               (fVar258 + 1.0 +
               fVar258 * fVar258 *
               (((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 + 0.008333452) * fVar258 +
                 0.041665796) * fVar258 + 0.16666666) * fVar258 + fVar211)) * auVar112._0_4_ + 1.0;
          auVar115._4_4_ =
               (fVar259 + 1.0 +
               fVar259 * fVar259 *
               (((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 + 0.008333452) * fVar259 +
                 0.041665796) * fVar259 + 0.16666666) * fVar259 + fVar212)) * auVar112._4_4_ + 1.0;
          auVar115._8_4_ =
               (fVar260 + 1.0 +
               fVar260 * fVar260 *
               (((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260 +
                 0.041665796) * fVar260 + 0.16666666) * fVar260 + fVar254)) * auVar112._8_4_ + 1.0;
          auVar115._12_4_ =
               (fVar261 + 1.0 +
               fVar261 * fVar261 *
               (((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261 +
                 0.041665796) * fVar261 + 0.16666666) * fVar261 + fVar257)) * auVar112._12_4_ + 1.0;
          auVar168._8_4_ = 0x800000;
          auVar168._0_8_ = 0x80000000800000;
          auVar168._12_4_ = 0x800000;
          auVar112 = vmaxps_avx(auVar115,auVar168);
          auVar164 = vpsrld_avx(auVar112,0x17);
          auVar218._8_4_ = 0xffffff82;
          auVar218._0_8_ = 0xffffff82ffffff82;
          auVar218._12_4_ = 0xffffff82;
          auVar164 = vpaddd_avx(auVar164,auVar218);
          auVar219._8_4_ = 0x807fffff;
          auVar219._0_8_ = 0x807fffff807fffff;
          auVar219._12_4_ = 0x807fffff;
          auVar112 = vandps_avx(auVar112,auVar219);
          auVar247 = vorps_avx(auVar112,auVar266._0_16_);
          auVar235 = vcvtdq2ps_avx(auVar164);
          auVar220._8_4_ = 0x3f3504f3;
          auVar220._0_8_ = 0x3f3504f33f3504f3;
          auVar220._12_4_ = 0x3f3504f3;
          auVar164 = vcmpps_avx(auVar247,auVar220,1);
          auVar112 = vandps_avx(auVar164,auVar247);
          fVar258 = auVar112._0_4_ + auVar247._0_4_ + -1.0;
          fVar259 = auVar112._4_4_ + auVar247._4_4_ + -1.0;
          fVar260 = auVar112._8_4_ + auVar247._8_4_ + -1.0;
          fVar261 = auVar112._12_4_ + auVar247._12_4_ + -1.0;
          auVar112 = vandps_avx(auVar164,auVar45);
          auVar164 = vsubps_avx(auVar235,auVar112);
          auVar112 = vcmpps_avx(auVar115,_DAT_004ed070,2);
          auVar169._0_4_ =
               (auVar164._0_4_ * 0.6931472 + fVar258 +
               (((((((((fVar258 * 0.070376836 + -0.1151461) * fVar258 + 0.116769984) * fVar258 +
                     -0.12420141) * fVar258 + 0.14249323) * fVar258 + -0.16668057) * fVar258 +
                  0.20000714) * fVar258 + -0.24999994) * fVar258 + 0.3333333) * fVar258 + -0.5) *
               fVar258 * fVar258) * -2.0;
          auVar169._4_4_ =
               (auVar164._4_4_ * 0.6931472 + fVar259 +
               (((((((((fVar259 * 0.070376836 + -0.1151461) * fVar259 + 0.116769984) * fVar259 +
                     -0.12420141) * fVar259 + 0.14249323) * fVar259 + -0.16668057) * fVar259 +
                  0.20000714) * fVar259 + -0.24999994) * fVar259 + 0.3333333) * fVar259 + -0.5) *
               fVar259 * fVar259) * -2.0;
          auVar169._8_4_ =
               (auVar164._8_4_ * 0.6931472 + fVar260 +
               (((((((((fVar260 * 0.070376836 + -0.1151461) * fVar260 + 0.116769984) * fVar260 +
                     -0.12420141) * fVar260 + 0.14249323) * fVar260 + -0.16668057) * fVar260 +
                  0.20000714) * fVar260 + -0.24999994) * fVar260 + 0.3333333) * fVar260 + -0.5) *
               fVar260 * fVar260) * -2.0;
          auVar169._12_4_ =
               (auVar164._12_4_ * 0.6931472 + fVar261 +
               (((((((((fVar261 * 0.070376836 + -0.1151461) * fVar261 + 0.116769984) * fVar261 +
                     -0.12420141) * fVar261 + 0.14249323) * fVar261 + -0.16668057) * fVar261 +
                  0.20000714) * fVar261 + -0.24999994) * fVar261 + 0.3333333) * fVar261 + -0.5) *
               fVar261 * fVar261) * -2.0;
          auVar190._8_4_ = 0x7fffffff;
          auVar190._0_8_ = 0x7fffffff7fffffff;
          auVar190._12_4_ = 0x7fffffff;
          auVar112 = vblendvps_avx(auVar169,auVar190,auVar112);
          auVar170._8_4_ = 0x42b0c0a5;
          auVar170._0_8_ = 0x42b0c0a542b0c0a5;
          auVar170._12_4_ = 0x42b0c0a5;
          auVar112 = vminps_avx(auVar112,auVar170);
          auVar171._8_4_ = 0xc2b0c0a5;
          auVar171._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar171._12_4_ = 0xc2b0c0a5;
          auVar235 = vmaxps_avx(auVar112,auVar171);
          auVar172._0_4_ = auVar235._0_4_ * 1.442695 + fVar211;
          auVar172._4_4_ = auVar235._4_4_ * 1.442695 + fVar212;
          auVar172._8_4_ = auVar235._8_4_ * 1.442695 + fVar254;
          auVar172._12_4_ = auVar235._12_4_ * 1.442695 + fVar257;
          auVar191._0_4_ = (int)auVar172._0_4_;
          auVar191._4_4_ = (int)auVar172._4_4_;
          auVar191._8_4_ = (int)auVar172._8_4_;
          auVar191._12_4_ = (int)auVar172._12_4_;
          auVar164 = vcvtdq2ps_avx(auVar191);
          auVar112 = vcmpps_avx(auVar172,auVar164,1);
          auVar112 = vandps_avx(auVar112,auVar45);
          auVar112 = vsubps_avx(auVar164,auVar112);
          auVar192._0_4_ = auVar112._0_4_ * 0.6931472;
          auVar192._4_4_ = auVar112._4_4_ * 0.6931472;
          auVar192._8_4_ = auVar112._8_4_ * 0.6931472;
          auVar192._12_4_ = auVar112._12_4_ * 0.6931472;
          auVar164 = vsubps_avx(auVar235,auVar192);
          fVar258 = auVar164._0_4_;
          fVar259 = auVar164._4_4_;
          fVar260 = auVar164._8_4_;
          fVar261 = auVar164._12_4_;
          auVar266 = ZEXT1664(auVar266._0_16_);
          auVar206 = ZEXT864(0) << 0x20;
          auVar173._0_4_ = (int)auVar112._0_4_;
          auVar173._4_4_ = (int)auVar112._4_4_;
          auVar173._8_4_ = (int)auVar112._8_4_;
          auVar173._12_4_ = (int)auVar112._12_4_;
          auVar112 = vpslld_avx(auVar173,0x17);
          auVar112 = vpaddd_avx(auVar112,auVar45);
          auVar116._0_4_ =
               (fVar258 + 1.0 +
               fVar258 * fVar258 *
               (fVar211 +
               ((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 + 0.008333452) * fVar258 +
                0.041665796) * fVar258 + 0.16666666) * fVar258)) * auVar112._0_4_ + 1.0;
          auVar116._4_4_ =
               (fVar259 + 1.0 +
               fVar259 * fVar259 *
               (fVar212 +
               ((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 + 0.008333452) * fVar259 +
                0.041665796) * fVar259 + 0.16666666) * fVar259)) * auVar112._4_4_ + 1.0;
          auVar116._8_4_ =
               (fVar260 + 1.0 +
               fVar260 * fVar260 *
               (fVar254 +
               ((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260 +
                0.041665796) * fVar260 + 0.16666666) * fVar260)) * auVar112._8_4_ + 1.0;
          auVar116._12_4_ =
               (fVar261 + 1.0 +
               fVar261 * fVar261 *
               (fVar257 +
               ((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261 +
                0.041665796) * fVar261 + 0.16666666) * fVar261)) * auVar112._12_4_ + 1.0;
          auVar112 = vrcpps_avx(auVar116);
          fVar211 = auVar112._0_4_;
          fVar212 = auVar112._4_4_;
          fVar254 = auVar112._8_4_;
          fVar257 = auVar112._12_4_;
          auVar117._0_4_ = auVar116._0_4_ * (fVar211 + fVar211);
          auVar117._4_4_ = auVar116._4_4_ * (fVar212 + fVar212);
          auVar117._8_4_ = auVar116._8_4_ * (fVar254 + fVar254);
          auVar117._12_4_ = auVar116._12_4_ * (fVar257 + fVar257);
          auVar221._8_4_ = 0x40000000;
          auVar221._0_8_ = 0x4000000040000000;
          auVar221._12_4_ = 0x40000000;
          auVar112 = vsubps_avx(auVar221,auVar117);
          auVar118._0_4_ = fVar211 + fVar211 + -1.0 + fVar211 * auVar112._0_4_;
          auVar118._4_4_ = fVar212 + fVar212 + -1.0 + fVar212 * auVar112._4_4_;
          auVar118._8_4_ = fVar254 + fVar254 + -1.0 + fVar254 * auVar112._8_4_;
          auVar118._12_4_ = fVar257 + fVar257 + -1.0 + fVar257 * auVar112._12_4_;
          goto LAB_002c24e2;
        case 6:
          fVar211 = **(float **)(&this->field_0xe8 + (long)p_Var9);
          fVar212 = (*(float **)(&this->field_0xe8 + (long)p_Var9))[1];
          auVar125._0_4_ = fVar211 * auVar65._0_4_ + fVar212;
          auVar125._4_4_ = fVar211 * auVar65._4_4_ + fVar212;
          auVar125._8_4_ = fVar211 * auVar65._8_4_ + fVar212;
          auVar125._12_4_ = fVar211 * auVar65._12_4_ + fVar212;
          auVar112 = vmaxps_avx(auVar125,auVar112);
          auVar118 = vminps_avx(auVar112,auVar45);
LAB_002c24e2:
          auVar124._0_4_ = auVar118._0_4_ * auVar65._0_4_;
          auVar124._4_4_ = auVar118._4_4_ * auVar65._4_4_;
          auVar124._8_4_ = auVar118._8_4_ * auVar65._8_4_;
          auVar124._12_4_ = auVar118._12_4_ * auVar65._12_4_;
        }
switchD_002c20bb_caseD_1:
        *(undefined1 (*) [16])((long)top_blob->data + uVar28 * 0x10) = auVar124;
      }
    }
    else {
      local_148 = 0;
      if (iVar38 == 8) {
        local_148 = 0;
        uVar30 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar30 = 0;
        }
        auVar206 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar266 = ZEXT864(0);
        for (uVar28 = 0; uVar28 != uVar30; uVar28 = uVar28 + 1) {
          fVar211 = 0.0;
          fVar212 = 0.0;
          fVar207 = 0.0;
          fVar210 = 0.0;
          fVar213 = 0.0;
          fVar214 = 0.0;
          fVar215 = 0.0;
          fVar216 = 0.0;
          fVar258 = 0.0;
          fVar259 = 0.0;
          fVar254 = 0.0;
          fVar257 = 0.0;
          fVar260 = 0.0;
          fVar261 = 0.0;
          fVar262 = 0.0;
          fVar263 = 0.0;
          if (lVar11 != 0) {
            pfVar41 = (float *)(lVar11 + uVar28 * 0x20);
            fVar254 = *pfVar41;
            fVar257 = pfVar41[1];
            fVar258 = pfVar41[2];
            fVar259 = pfVar41[3];
            fVar260 = pfVar41[4];
            fVar261 = pfVar41[5];
            fVar262 = pfVar41[6];
            fVar263 = pfVar41[7];
          }
          pvVar12 = (this->weight_data_tm).data;
          sVar13 = (this->weight_data_tm).elemsize;
          lVar34 = (long)(this->weight_data_tm).w;
          pfVar31 = (float *)(uVar28 * lVar34 * sVar13 + (long)pvVar12);
          lVar36 = 0;
          lVar37 = 0;
          fVar272 = 0.0;
          fVar273 = 0.0;
          fVar268 = 0.0;
          fVar271 = 0.0;
          fVar274 = 0.0;
          fVar275 = 0.0;
          fVar276 = 0.0;
          fVar277 = 0.0;
          fVar104 = 0.0;
          fVar105 = 0.0;
          fVar63 = 0.0;
          fVar103 = 0.0;
          fVar106 = 0.0;
          fVar107 = 0.0;
          fVar108 = 0.0;
          fVar109 = 0.0;
          fVar182 = 0.0;
          fVar183 = 0.0;
          fVar163 = 0.0;
          fVar181 = 0.0;
          fVar184 = 0.0;
          fVar185 = 0.0;
          fVar186 = 0.0;
          fVar187 = 0.0;
          fVar157 = 0.0;
          fVar158 = 0.0;
          fVar110 = 0.0;
          fVar156 = 0.0;
          fVar159 = 0.0;
          fVar160 = 0.0;
          fVar161 = 0.0;
          fVar162 = 0.0;
          fVar227 = 0.0;
          fVar228 = 0.0;
          fVar217 = 0.0;
          fVar226 = 0.0;
          fVar229 = 0.0;
          fVar230 = 0.0;
          fVar231 = 0.0;
          fVar232 = 0.0;
          fVar239 = 0.0;
          fVar240 = 0.0;
          fVar233 = 0.0;
          fVar238 = 0.0;
          fVar241 = 0.0;
          fVar242 = 0.0;
          fVar243 = 0.0;
          fVar244 = 0.0;
          pfVar41 = local_e8;
          for (iVar38 = 0; iVar38 + 7 < iVar35; iVar38 = iVar38 + 8) {
            fVar1 = *pfVar41;
            fVar2 = pfVar41[1];
            fVar3 = pfVar41[2];
            fVar4 = pfVar41[3];
            fVar254 = fVar1 * *pfVar31 + fVar254;
            fVar257 = fVar1 * pfVar31[1] + fVar257;
            fVar258 = fVar1 * pfVar31[2] + fVar258;
            fVar259 = fVar1 * pfVar31[3] + fVar259;
            fVar260 = fVar1 * pfVar31[4] + fVar260;
            fVar261 = fVar1 * pfVar31[5] + fVar261;
            fVar262 = fVar1 * pfVar31[6] + fVar262;
            fVar263 = fVar1 + fVar263;
            fVar233 = fVar2 * pfVar31[8] + fVar233;
            fVar238 = fVar2 * pfVar31[9] + fVar238;
            fVar239 = fVar2 * pfVar31[10] + fVar239;
            fVar240 = fVar2 * pfVar31[0xb] + fVar240;
            fVar241 = fVar2 * pfVar31[0xc] + fVar241;
            fVar242 = fVar2 * pfVar31[0xd] + fVar242;
            fVar243 = fVar2 * pfVar31[0xe] + fVar243;
            fVar244 = fVar1 + fVar244;
            fVar217 = fVar3 * pfVar31[0x10] + fVar217;
            fVar226 = fVar3 * pfVar31[0x11] + fVar226;
            fVar227 = fVar3 * pfVar31[0x12] + fVar227;
            fVar228 = fVar3 * pfVar31[0x13] + fVar228;
            fVar229 = fVar3 * pfVar31[0x14] + fVar229;
            fVar230 = fVar3 * pfVar31[0x15] + fVar230;
            fVar231 = fVar3 * pfVar31[0x16] + fVar231;
            fVar232 = fVar1 + fVar232;
            fVar2 = pfVar41[4];
            fVar3 = pfVar41[5];
            fVar5 = pfVar41[6];
            fVar6 = pfVar41[7];
            fVar110 = fVar4 * pfVar31[0x18] + fVar110;
            fVar156 = fVar4 * pfVar31[0x19] + fVar156;
            fVar157 = fVar4 * pfVar31[0x1a] + fVar157;
            fVar158 = fVar4 * pfVar31[0x1b] + fVar158;
            fVar159 = fVar4 * pfVar31[0x1c] + fVar159;
            fVar160 = fVar4 * pfVar31[0x1d] + fVar160;
            fVar161 = fVar4 * pfVar31[0x1e] + fVar161;
            fVar162 = fVar1 + fVar162;
            fVar163 = fVar2 * pfVar31[0x20] + fVar163;
            fVar181 = fVar2 * pfVar31[0x21] + fVar181;
            fVar182 = fVar2 * pfVar31[0x22] + fVar182;
            fVar183 = fVar2 * pfVar31[0x23] + fVar183;
            fVar184 = fVar2 * pfVar31[0x24] + fVar184;
            fVar185 = fVar2 * pfVar31[0x25] + fVar185;
            fVar186 = fVar2 * pfVar31[0x26] + fVar186;
            fVar187 = fVar2 + fVar187;
            fVar63 = fVar3 * pfVar31[0x28] + fVar63;
            fVar103 = fVar3 * pfVar31[0x29] + fVar103;
            fVar104 = fVar3 * pfVar31[0x2a] + fVar104;
            fVar105 = fVar3 * pfVar31[0x2b] + fVar105;
            fVar106 = fVar3 * pfVar31[0x2c] + fVar106;
            fVar107 = fVar3 * pfVar31[0x2d] + fVar107;
            fVar108 = fVar3 * pfVar31[0x2e] + fVar108;
            fVar109 = fVar1 + fVar109;
            fVar268 = fVar5 * pfVar31[0x30] + fVar268;
            fVar271 = fVar5 * pfVar31[0x31] + fVar271;
            fVar272 = fVar5 * pfVar31[0x32] + fVar272;
            fVar273 = fVar5 * pfVar31[0x33] + fVar273;
            fVar274 = fVar5 * pfVar31[0x34] + fVar274;
            fVar275 = fVar5 * pfVar31[0x35] + fVar275;
            fVar276 = fVar5 * pfVar31[0x36] + fVar276;
            fVar277 = fVar1 + fVar277;
            fVar207 = fVar6 * pfVar31[0x38] + fVar207;
            fVar210 = fVar6 * pfVar31[0x39] + fVar210;
            fVar211 = fVar6 * pfVar31[0x3a] + fVar211;
            fVar212 = fVar6 * pfVar31[0x3b] + fVar212;
            fVar213 = fVar6 * pfVar31[0x3c] + fVar213;
            fVar214 = fVar6 * pfVar31[0x3d] + fVar214;
            fVar215 = fVar6 * pfVar31[0x3e] + fVar215;
            fVar216 = fVar6 + fVar216;
            pfVar41 = pfVar41 + 8;
            pfVar31 = pfVar31 + 0x40;
            lVar37 = lVar37 + 0x20;
            lVar36 = lVar36 + 8;
          }
          lVar34 = sVar13 * uVar28 * lVar34;
          for (; iVar38 + 3 < iVar35; iVar38 = iVar38 + 4) {
            fVar1 = *(float *)((long)local_e8 + lVar37);
            fVar2 = *(float *)((long)local_e8 + lVar37 + 4);
            fVar3 = *(float *)((long)local_e8 + lVar37 + 8);
            fVar4 = *(float *)((long)local_e8 + lVar37 + 0xc);
            pfVar41 = (float *)((long)pvVar12 + lVar37 * 8 + lVar34);
            pfVar29 = (float *)((long)pvVar12 + lVar37 * 8 + lVar34 + 0x20);
            fVar254 = fVar254 + fVar1 * *pfVar41;
            fVar257 = fVar257 + fVar1 * pfVar41[1];
            fVar258 = fVar258 + fVar1 * pfVar41[2];
            fVar259 = fVar259 + fVar1 * pfVar41[3];
            fVar260 = fVar260 + fVar1 * pfVar41[4];
            fVar261 = fVar261 + fVar1 * pfVar41[5];
            fVar262 = fVar262 + fVar1 * pfVar41[6];
            fVar263 = fVar263 + fVar1;
            fVar233 = fVar2 * *pfVar29 + fVar233;
            fVar238 = fVar2 * pfVar29[1] + fVar238;
            fVar239 = fVar2 * pfVar29[2] + fVar239;
            fVar240 = fVar2 * pfVar29[3] + fVar240;
            fVar241 = fVar2 * pfVar29[4] + fVar241;
            fVar242 = fVar2 * pfVar29[5] + fVar242;
            fVar243 = fVar2 * pfVar29[6] + fVar243;
            fVar244 = fVar2 + fVar244;
            pfVar41 = (float *)((long)pvVar12 + lVar37 * 8 + lVar34 + 0x40);
            fVar217 = fVar3 * *pfVar41 + fVar217;
            fVar226 = fVar3 * pfVar41[1] + fVar226;
            fVar227 = fVar3 * pfVar41[2] + fVar227;
            fVar228 = fVar3 * pfVar41[3] + fVar228;
            fVar229 = fVar3 * pfVar41[4] + fVar229;
            fVar230 = fVar3 * pfVar41[5] + fVar230;
            fVar231 = fVar3 * pfVar41[6] + fVar231;
            fVar232 = fVar1 + fVar232;
            pfVar41 = (float *)((long)pvVar12 + lVar37 * 8 + lVar34 + 0x60);
            fVar110 = fVar4 * *pfVar41 + fVar110;
            fVar156 = fVar4 * pfVar41[1] + fVar156;
            fVar157 = fVar4 * pfVar41[2] + fVar157;
            fVar158 = fVar4 * pfVar41[3] + fVar158;
            fVar159 = fVar4 * pfVar41[4] + fVar159;
            fVar160 = fVar4 * pfVar41[5] + fVar160;
            fVar161 = fVar4 * pfVar41[6] + fVar161;
            fVar162 = fVar1 + fVar162;
            pfVar31 = pfVar31 + 0x20;
            lVar37 = lVar37 + 0x10;
            lVar36 = lVar36 + 4;
          }
          for (; (int)lVar36 < iVar35; lVar36 = lVar36 + 1) {
            fVar1 = local_e8[lVar36];
            fVar254 = fVar254 + fVar1 * *pfVar31;
            fVar257 = fVar257 + fVar1 * pfVar31[1];
            fVar258 = fVar258 + fVar1 * pfVar31[2];
            fVar259 = fVar259 + fVar1 * pfVar31[3];
            fVar260 = fVar260 + fVar1 * pfVar31[4];
            fVar261 = fVar261 + fVar1 * pfVar31[5];
            fVar262 = fVar262 + fVar1 * pfVar31[6];
            fVar263 = fVar263 + fVar1;
            pfVar31 = pfVar31 + 8;
          }
          fVar254 = fVar254 + fVar268 + fVar207 + fVar63 + fVar163 + fVar233 + fVar110 + fVar217;
          fVar257 = fVar257 + fVar271 + fVar210 + fVar103 + fVar181 + fVar238 + fVar156 + fVar226;
          auVar84._0_8_ = CONCAT44(fVar257,fVar254);
          auVar84._8_4_ =
               fVar258 + fVar272 + fVar211 + fVar104 + fVar182 + fVar239 + fVar157 + fVar227;
          auVar84._12_4_ =
               fVar259 + fVar273 + fVar212 + fVar105 + fVar183 + fVar240 + fVar158 + fVar228;
          auVar84._16_4_ =
               fVar260 + fVar274 + fVar213 + fVar106 + fVar184 + fVar241 + fVar159 + fVar229;
          auVar84._20_4_ =
               fVar261 + fVar275 + fVar214 + fVar107 + fVar185 + fVar242 + fVar160 + fVar230;
          auVar84._24_4_ =
               fVar262 + fVar276 + fVar215 + fVar108 + fVar186 + fVar243 + fVar161 + fVar231;
          auVar84._28_4_ =
               fVar263 + fVar277 + fVar216 + fVar109 + fVar187 + fVar244 + fVar162 + fVar232;
          auVar152 = auVar84;
          if (5 < iVar26 - 1U) goto switchD_002c19f6_caseD_1;
          auVar264 = auVar266._0_32_;
          auVar152 = vmaxps_avx(auVar264,auVar84);
          auVar56 = auVar206._0_32_;
          fVar211 = auVar206._0_4_;
          fVar212 = auVar206._4_4_;
          fVar258 = auVar206._8_4_;
          fVar259 = auVar206._12_4_;
          fVar260 = auVar206._16_4_;
          fVar261 = auVar206._20_4_;
          fVar262 = auVar206._24_4_;
          fVar263 = auVar206._28_4_;
          switch(iVar26) {
          case 2:
            auVar56 = vminps_avx(auVar264,auVar84);
            fVar211 = **(float **)(&this->field_0xe8 + (long)p_Var9);
            auVar143._0_4_ = fVar211 * auVar56._0_4_ + auVar152._0_4_;
            auVar143._4_4_ = fVar211 * auVar56._4_4_ + auVar152._4_4_;
            auVar143._8_4_ = fVar211 * auVar56._8_4_ + auVar152._8_4_;
            auVar143._12_4_ = fVar211 * auVar56._12_4_ + auVar152._12_4_;
            auVar143._16_4_ = fVar211 * auVar56._16_4_ + auVar152._16_4_;
            auVar143._20_4_ = fVar211 * auVar56._20_4_ + auVar152._20_4_;
            auVar143._24_4_ = fVar211 * auVar56._24_4_ + auVar152._24_4_;
            auVar143._28_4_ = auVar56._28_4_ + auVar152._28_4_;
            auVar152 = auVar143;
            break;
          case 3:
            uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
            auVar50._4_4_ = uVar7;
            auVar50._0_4_ = uVar7;
            auVar50._8_4_ = uVar7;
            auVar50._12_4_ = uVar7;
            auVar50._16_4_ = uVar7;
            auVar50._20_4_ = uVar7;
            auVar50._24_4_ = uVar7;
            auVar50._28_4_ = uVar7;
            uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
            auVar151._4_4_ = uVar7;
            auVar151._0_4_ = uVar7;
            auVar151._8_4_ = uVar7;
            auVar151._12_4_ = uVar7;
            auVar151._16_4_ = uVar7;
            auVar151._20_4_ = uVar7;
            auVar151._24_4_ = uVar7;
            auVar151._28_4_ = uVar7;
            auVar56 = vmaxps_avx(auVar84,auVar50);
            auVar152 = vminps_avx(auVar56,auVar151);
            break;
          case 4:
            auVar51._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
            auVar51._8_4_ = -auVar84._8_4_;
            auVar51._12_4_ = -auVar84._12_4_;
            auVar51._16_4_ = -auVar84._16_4_;
            auVar51._20_4_ = -auVar84._20_4_;
            auVar51._24_4_ = -auVar84._24_4_;
            auVar51._28_4_ = -auVar84._28_4_;
            auVar85._8_4_ = 0x42b0c0a5;
            auVar85._0_8_ = 0x42b0c0a542b0c0a5;
            auVar85._12_4_ = 0x42b0c0a5;
            auVar85._16_4_ = 0x42b0c0a5;
            auVar85._20_4_ = 0x42b0c0a5;
            auVar85._24_4_ = 0x42b0c0a5;
            auVar85._28_4_ = 0x42b0c0a5;
            auVar264 = vminps_avx(auVar51,auVar85);
            auVar86._8_4_ = 0xc2b0c0a5;
            auVar86._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar86._12_4_ = 0xc2b0c0a5;
            auVar86._16_4_ = 0xc2b0c0a5;
            auVar86._20_4_ = 0xc2b0c0a5;
            auVar86._24_4_ = 0xc2b0c0a5;
            auVar86._28_4_ = 0xc2b0c0a5;
            auVar209 = vmaxps_avx(auVar264,auVar86);
            auVar87._0_4_ = auVar209._0_4_ * 1.442695 + 0.5;
            auVar87._4_4_ = auVar209._4_4_ * 1.442695 + 0.5;
            auVar87._8_4_ = auVar209._8_4_ * 1.442695 + 0.5;
            auVar87._12_4_ = auVar209._12_4_ * 1.442695 + 0.5;
            auVar87._16_4_ = auVar209._16_4_ * 1.442695 + 0.5;
            auVar87._20_4_ = auVar209._20_4_ * 1.442695 + 0.5;
            auVar87._24_4_ = auVar209._24_4_ * 1.442695 + 0.5;
            auVar87._28_4_ = 0x3ff8aa3b;
            auVar205 = vroundps_avx(auVar87,1);
            auVar264 = vcmpps_avx(auVar87,auVar205,1);
            auVar264 = vandps_avx(auVar264,auVar56);
            auVar264 = vsubps_avx(auVar205,auVar264);
            fVar254 = auVar209._0_4_ + auVar264._0_4_ * -0.6931472;
            fVar257 = auVar209._4_4_ + auVar264._4_4_ * -0.6931472;
            fVar207 = auVar209._8_4_ + auVar264._8_4_ * -0.6931472;
            fVar210 = auVar209._12_4_ + auVar264._12_4_ * -0.6931472;
            fVar213 = auVar209._16_4_ + auVar264._16_4_ * -0.6931472;
            fVar214 = auVar209._20_4_ + auVar264._20_4_ * -0.6931472;
            fVar215 = auVar209._24_4_ + auVar264._24_4_ * -0.6931472;
            auVar64._0_4_ = (int)auVar264._0_4_;
            auVar64._4_4_ = (int)auVar264._4_4_;
            auVar64._8_4_ = (int)auVar264._8_4_;
            auVar64._12_4_ = (int)auVar264._12_4_;
            auVar88._16_4_ = (int)auVar264._16_4_;
            auVar88._0_16_ = auVar64;
            auVar88._20_4_ = (int)auVar264._20_4_;
            auVar88._24_4_ = (int)auVar264._24_4_;
            auVar88._28_4_ = (int)auVar264._28_4_;
            auVar164 = vpslld_avx(auVar64,0x17);
            auVar112 = vpslld_avx(auVar88._16_16_,0x17);
            auVar165._8_4_ = 0x3f800000;
            auVar165._0_8_ = 0x3f8000003f800000;
            auVar165._12_4_ = 0x3f800000;
            auVar112 = vpaddd_avx(auVar112,auVar165);
            auVar164 = vpaddd_avx(auVar164,auVar165);
            auVar52._0_4_ =
                 (fVar254 + fVar211 +
                 fVar254 * fVar254 *
                 (((((fVar254 * 0.00019875691 + 0.0013981999) * fVar254 + 0.008333452) * fVar254 +
                   0.041665796) * fVar254 + 0.16666666) * fVar254 + 0.5)) * auVar164._0_4_ + fVar211
            ;
            auVar52._4_4_ =
                 (fVar257 + fVar212 +
                 fVar257 * fVar257 *
                 (((((fVar257 * 0.00019875691 + 0.0013981999) * fVar257 + 0.008333452) * fVar257 +
                   0.041665796) * fVar257 + 0.16666666) * fVar257 + 0.5)) * auVar164._4_4_ + fVar212
            ;
            auVar52._8_4_ =
                 (fVar207 + fVar258 +
                 fVar207 * fVar207 *
                 (((((fVar207 * 0.00019875691 + 0.0013981999) * fVar207 + 0.008333452) * fVar207 +
                   0.041665796) * fVar207 + 0.16666666) * fVar207 + 0.5)) * auVar164._8_4_ + fVar258
            ;
            auVar52._12_4_ =
                 (fVar210 + fVar259 +
                 fVar210 * fVar210 *
                 (((((fVar210 * 0.00019875691 + 0.0013981999) * fVar210 + 0.008333452) * fVar210 +
                   0.041665796) * fVar210 + 0.16666666) * fVar210 + 0.5)) * auVar164._12_4_ +
                 fVar259;
            auVar52._16_4_ =
                 (fVar213 + fVar260 +
                 fVar213 * fVar213 *
                 (((((fVar213 * 0.00019875691 + 0.0013981999) * fVar213 + 0.008333452) * fVar213 +
                   0.041665796) * fVar213 + 0.16666666) * fVar213 + 0.5)) * auVar112._0_4_ + fVar260
            ;
            auVar52._20_4_ =
                 (fVar214 + fVar261 +
                 fVar214 * fVar214 *
                 (((((fVar214 * 0.00019875691 + 0.0013981999) * fVar214 + 0.008333452) * fVar214 +
                   0.041665796) * fVar214 + 0.16666666) * fVar214 + 0.5)) * auVar112._4_4_ + fVar261
            ;
            auVar52._24_4_ =
                 (fVar215 + fVar262 +
                 fVar215 * fVar215 *
                 (((((fVar215 * 0.00019875691 + 0.0013981999) * fVar215 + 0.008333452) * fVar215 +
                   0.041665796) * fVar215 + 0.16666666) * fVar215 + 0.5)) * auVar112._8_4_ + fVar262
            ;
            auVar52._28_4_ = auVar209._28_4_ + -0.6931472 + fVar263 + -0.6931472 + fVar263;
            auVar264 = vrcpps_avx(auVar52);
            fVar211 = auVar264._0_4_;
            fVar212 = auVar264._4_4_;
            auVar20._4_4_ = auVar52._4_4_ * fVar212;
            auVar20._0_4_ = auVar52._0_4_ * fVar211;
            fVar254 = auVar264._8_4_;
            auVar20._8_4_ = auVar52._8_4_ * fVar254;
            fVar257 = auVar264._12_4_;
            auVar20._12_4_ = auVar52._12_4_ * fVar257;
            fVar258 = auVar264._16_4_;
            auVar20._16_4_ = auVar52._16_4_ * fVar258;
            fVar259 = auVar264._20_4_;
            auVar20._20_4_ = auVar52._20_4_ * fVar259;
            fVar260 = auVar264._24_4_;
            auVar20._24_4_ = auVar52._24_4_ * fVar260;
            auVar20._28_4_ = auVar52._28_4_;
            auVar56 = vsubps_avx(auVar56,auVar20);
            auVar152._0_4_ = fVar211 + fVar211 * auVar56._0_4_;
            auVar152._4_4_ = fVar212 + fVar212 * auVar56._4_4_;
            auVar152._8_4_ = fVar254 + fVar254 * auVar56._8_4_;
            auVar152._12_4_ = fVar257 + fVar257 * auVar56._12_4_;
            auVar152._16_4_ = fVar258 + fVar258 * auVar56._16_4_;
            auVar152._20_4_ = fVar259 + fVar259 * auVar56._20_4_;
            auVar152._24_4_ = fVar260 + fVar260 * auVar56._24_4_;
            auVar152._28_4_ = auVar264._28_4_ + auVar56._28_4_;
            break;
          case 5:
            auVar248._8_4_ = 0x42b0c0a5;
            auVar248._0_8_ = 0x42b0c0a542b0c0a5;
            auVar248._12_4_ = 0x42b0c0a5;
            auVar248._16_4_ = 0x42b0c0a5;
            auVar248._20_4_ = 0x42b0c0a5;
            auVar248._24_4_ = 0x42b0c0a5;
            auVar248._28_4_ = 0x42b0c0a5;
            auVar264 = vminps_avx(auVar248,auVar84);
            auVar250._8_4_ = 0xc2b0c0a5;
            auVar250._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar250._12_4_ = 0xc2b0c0a5;
            auVar250._16_4_ = 0xc2b0c0a5;
            auVar250._20_4_ = 0xc2b0c0a5;
            auVar250._24_4_ = 0xc2b0c0a5;
            auVar250._28_4_ = 0xc2b0c0a5;
            auVar209 = vmaxps_avx(auVar250,auVar264);
            auVar265._8_4_ = 0x3f000000;
            auVar265._0_8_ = 0x3f0000003f000000;
            auVar265._12_4_ = 0x3f000000;
            auVar265._16_4_ = 0x3f000000;
            auVar265._20_4_ = 0x3f000000;
            auVar265._24_4_ = 0x3f000000;
            auVar265._28_4_ = 0x3f000000;
            auVar144._0_4_ = auVar209._0_4_ * 1.442695 + 0.5;
            auVar144._4_4_ = auVar209._4_4_ * 1.442695 + 0.5;
            auVar144._8_4_ = auVar209._8_4_ * 1.442695 + 0.5;
            auVar144._12_4_ = auVar209._12_4_ * 1.442695 + 0.5;
            auVar144._16_4_ = auVar209._16_4_ * 1.442695 + 0.5;
            auVar144._20_4_ = auVar209._20_4_ * 1.442695 + 0.5;
            auVar144._24_4_ = auVar209._24_4_ * 1.442695 + 0.5;
            auVar144._28_4_ = auVar152._28_4_ + 0.5;
            auVar205 = vroundps_avx(auVar144,1);
            auVar264 = vcmpps_avx(auVar144,auVar205,1);
            auVar264 = vandps_avx(auVar264,auVar56);
            auVar264 = vsubps_avx(auVar205,auVar264);
            auVar16._4_4_ = auVar264._4_4_ * 0.6931472;
            auVar16._0_4_ = auVar264._0_4_ * 0.6931472;
            auVar16._8_4_ = auVar264._8_4_ * 0.6931472;
            auVar16._12_4_ = auVar264._12_4_ * 0.6931472;
            auVar16._16_4_ = auVar264._16_4_ * 0.6931472;
            auVar16._20_4_ = auVar264._20_4_ * 0.6931472;
            auVar16._24_4_ = auVar264._24_4_ * 0.6931472;
            auVar16._28_4_ = auVar205._28_4_;
            auVar209 = vsubps_avx(auVar209,auVar16);
            fVar207 = auVar209._0_4_;
            fVar210 = auVar209._4_4_;
            fVar213 = auVar209._8_4_;
            fVar214 = auVar209._12_4_;
            fVar215 = auVar209._16_4_;
            fVar216 = auVar209._20_4_;
            fVar104 = auVar209._24_4_;
            auVar111._0_4_ = (int)auVar264._0_4_;
            auVar111._4_4_ = (int)auVar264._4_4_;
            auVar111._8_4_ = (int)auVar264._8_4_;
            auVar111._12_4_ = (int)auVar264._12_4_;
            auVar145._16_4_ = (int)auVar264._16_4_;
            auVar145._0_16_ = auVar111;
            auVar145._20_4_ = (int)auVar264._20_4_;
            auVar145._24_4_ = (int)auVar264._24_4_;
            auVar145._28_4_ = (int)auVar264._28_4_;
            auVar164 = vpslld_avx(auVar111,0x17);
            auVar112 = vpslld_avx(auVar145._16_16_,0x17);
            auVar245._8_4_ = 0x3f800000;
            auVar245._0_8_ = 0x3f8000003f800000;
            auVar245._12_4_ = 0x3f800000;
            auVar112 = vpaddd_avx(auVar245,auVar112);
            auVar164 = vpaddd_avx(auVar245,auVar164);
            auVar146._0_4_ =
                 (fVar207 + fVar211 +
                 fVar207 * fVar207 *
                 (((((fVar207 * 0.00019875691 + 0.0013981999) * fVar207 + 0.008333452) * fVar207 +
                   0.041665796) * fVar207 + 0.16666666) * fVar207 + 0.5)) * auVar164._0_4_ + fVar211
            ;
            auVar146._4_4_ =
                 (fVar210 + fVar212 +
                 fVar210 * fVar210 *
                 (((((fVar210 * 0.00019875691 + 0.0013981999) * fVar210 + 0.008333452) * fVar210 +
                   0.041665796) * fVar210 + 0.16666666) * fVar210 + 0.5)) * auVar164._4_4_ + fVar212
            ;
            auVar146._8_4_ =
                 (fVar213 + fVar258 +
                 fVar213 * fVar213 *
                 (((((fVar213 * 0.00019875691 + 0.0013981999) * fVar213 + 0.008333452) * fVar213 +
                   0.041665796) * fVar213 + 0.16666666) * fVar213 + 0.5)) * auVar164._8_4_ + fVar258
            ;
            auVar146._12_4_ =
                 (fVar214 + fVar259 +
                 fVar214 * fVar214 *
                 (((((fVar214 * 0.00019875691 + 0.0013981999) * fVar214 + 0.008333452) * fVar214 +
                   0.041665796) * fVar214 + 0.16666666) * fVar214 + 0.5)) * auVar164._12_4_ +
                 fVar259;
            auVar146._16_4_ =
                 (fVar215 + fVar260 +
                 fVar215 * fVar215 *
                 (((((fVar215 * 0.00019875691 + 0.0013981999) * fVar215 + 0.008333452) * fVar215 +
                   0.041665796) * fVar215 + 0.16666666) * fVar215 + 0.5)) * auVar112._0_4_ + fVar260
            ;
            auVar146._20_4_ =
                 (fVar216 + fVar261 +
                 fVar216 * fVar216 *
                 (((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) * fVar216 +
                   0.041665796) * fVar216 + 0.16666666) * fVar216 + 0.5)) * auVar112._4_4_ + fVar261
            ;
            auVar146._24_4_ =
                 (fVar104 + fVar262 +
                 fVar104 * fVar104 *
                 (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) * fVar104 +
                   0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5)) * auVar112._8_4_ + fVar262
            ;
            auVar146._28_4_ = auVar209._28_4_ + fVar263 + auVar205._28_4_ + fVar263;
            auVar47._8_4_ = 0x800000;
            auVar47._0_8_ = 0x80000000800000;
            auVar47._12_4_ = 0x800000;
            auVar47._16_4_ = 0x800000;
            auVar47._20_4_ = 0x800000;
            auVar47._24_4_ = 0x800000;
            auVar47._28_4_ = 0x800000;
            auVar205 = vmaxps_avx(auVar146,auVar47);
            auVar112 = vpsrld_avx(auVar205._16_16_,0x17);
            auVar177._8_4_ = 0x807fffff;
            auVar177._0_8_ = 0x807fffff807fffff;
            auVar177._12_4_ = 0x807fffff;
            auVar177._16_4_ = 0x807fffff;
            auVar177._20_4_ = 0x807fffff;
            auVar177._24_4_ = 0x807fffff;
            auVar177._28_4_ = 0x807fffff;
            auVar264 = vandps_avx(auVar205,auVar177);
            auVar91 = vorps_avx(auVar265,auVar264);
            auVar223._8_4_ = 0x3f3504f3;
            auVar223._0_8_ = 0x3f3504f33f3504f3;
            auVar223._12_4_ = 0x3f3504f3;
            auVar223._16_4_ = 0x3f3504f3;
            auVar223._20_4_ = 0x3f3504f3;
            auVar223._24_4_ = 0x3f3504f3;
            auVar223._28_4_ = 0x3f3504f3;
            auVar209 = vcmpps_avx(auVar223,auVar91,2);
            auVar264 = vandnps_avx(auVar209,auVar91);
            fVar207 = auVar264._0_4_ + auVar91._0_4_ + -1.0;
            fVar210 = auVar264._4_4_ + auVar91._4_4_ + -1.0;
            fVar213 = auVar264._8_4_ + auVar91._8_4_ + -1.0;
            fVar214 = auVar264._12_4_ + auVar91._12_4_ + -1.0;
            fVar215 = auVar264._16_4_ + auVar91._16_4_ + -1.0;
            fVar216 = auVar264._20_4_ + auVar91._20_4_ + -1.0;
            fVar104 = auVar264._24_4_ + auVar91._24_4_ + -1.0;
            auVar112 = vpsubd_avx(auVar112,auVar209._16_16_);
            auVar164 = vpsrld_avx(auVar205._0_16_,0x17);
            auVar234._8_4_ = 0xffffff81;
            auVar234._0_8_ = 0xffffff81ffffff81;
            auVar234._12_4_ = 0xffffff81;
            auVar112 = vpaddd_avx(auVar234,auVar112);
            auVar164 = vpsubd_avx(auVar164,auVar209._0_16_);
            auVar164 = vpaddd_avx(auVar234,auVar164);
            auVar48._16_16_ = auVar112;
            auVar48._0_16_ = auVar164;
            auVar209 = vcmpps_avx(auVar146,_DAT_004f1a40,2);
            auVar205 = vcvtdq2ps_avx(auVar48);
            auVar17._4_4_ =
                 (auVar205._4_4_ * 0.6931472 + fVar210 +
                 fVar210 * fVar210 *
                 (((((((((fVar210 * 0.070376836 + -0.1151461) * fVar210 + 0.116769984) * fVar210 +
                       -0.12420141) * fVar210 + 0.14249323) * fVar210 + -0.16668057) * fVar210 +
                    0.20000714) * fVar210 + -0.24999994) * fVar210 + 0.3333333) * fVar210 + -0.5)) *
                 -2.0;
            auVar17._0_4_ =
                 (auVar205._0_4_ * 0.6931472 + fVar207 +
                 fVar207 * fVar207 *
                 (((((((((fVar207 * 0.070376836 + -0.1151461) * fVar207 + 0.116769984) * fVar207 +
                       -0.12420141) * fVar207 + 0.14249323) * fVar207 + -0.16668057) * fVar207 +
                    0.20000714) * fVar207 + -0.24999994) * fVar207 + 0.3333333) * fVar207 + -0.5)) *
                 -2.0;
            auVar17._8_4_ =
                 (auVar205._8_4_ * 0.6931472 + fVar213 +
                 fVar213 * fVar213 *
                 (((((((((fVar213 * 0.070376836 + -0.1151461) * fVar213 + 0.116769984) * fVar213 +
                       -0.12420141) * fVar213 + 0.14249323) * fVar213 + -0.16668057) * fVar213 +
                    0.20000714) * fVar213 + -0.24999994) * fVar213 + 0.3333333) * fVar213 + -0.5)) *
                 -2.0;
            auVar17._12_4_ =
                 (auVar205._12_4_ * 0.6931472 + fVar214 +
                 fVar214 * fVar214 *
                 (((((((((fVar214 * 0.070376836 + -0.1151461) * fVar214 + 0.116769984) * fVar214 +
                       -0.12420141) * fVar214 + 0.14249323) * fVar214 + -0.16668057) * fVar214 +
                    0.20000714) * fVar214 + -0.24999994) * fVar214 + 0.3333333) * fVar214 + -0.5)) *
                 -2.0;
            auVar17._16_4_ =
                 (auVar205._16_4_ * 0.6931472 + fVar215 +
                 fVar215 * fVar215 *
                 (((((((((fVar215 * 0.070376836 + -0.1151461) * fVar215 + 0.116769984) * fVar215 +
                       -0.12420141) * fVar215 + 0.14249323) * fVar215 + -0.16668057) * fVar215 +
                    0.20000714) * fVar215 + -0.24999994) * fVar215 + 0.3333333) * fVar215 + -0.5)) *
                 -2.0;
            auVar17._20_4_ =
                 (auVar205._20_4_ * 0.6931472 + fVar216 +
                 fVar216 * fVar216 *
                 (((((((((fVar216 * 0.070376836 + -0.1151461) * fVar216 + 0.116769984) * fVar216 +
                       -0.12420141) * fVar216 + 0.14249323) * fVar216 + -0.16668057) * fVar216 +
                    0.20000714) * fVar216 + -0.24999994) * fVar216 + 0.3333333) * fVar216 + -0.5)) *
                 -2.0;
            auVar17._24_4_ =
                 (auVar205._24_4_ * 0.6931472 + fVar104 +
                 fVar104 * fVar104 *
                 (((((((((fVar104 * 0.070376836 + -0.1151461) * fVar104 + 0.116769984) * fVar104 +
                       -0.12420141) * fVar104 + 0.14249323) * fVar104 + -0.16668057) * fVar104 +
                    0.20000714) * fVar104 + -0.24999994) * fVar104 + 0.3333333) * fVar104 + -0.5)) *
                 -2.0;
            auVar17._28_4_ = auVar205._28_4_ + auVar264._28_4_ + auVar91._28_4_ + -1.0 + 0.0;
            auVar178._8_4_ = 0x7fffffff;
            auVar178._0_8_ = 0x7fffffff7fffffff;
            auVar178._12_4_ = 0x7fffffff;
            auVar178._16_4_ = 0x7fffffff;
            auVar178._20_4_ = 0x7fffffff;
            auVar178._24_4_ = 0x7fffffff;
            auVar178._28_4_ = 0x7fffffff;
            auVar264 = vblendvps_avx(auVar17,auVar178,auVar209);
            auVar147._8_4_ = 0x42b0c0a5;
            auVar147._0_8_ = 0x42b0c0a542b0c0a5;
            auVar147._12_4_ = 0x42b0c0a5;
            auVar147._16_4_ = 0x42b0c0a5;
            auVar147._20_4_ = 0x42b0c0a5;
            auVar147._24_4_ = 0x42b0c0a5;
            auVar147._28_4_ = 0x42b0c0a5;
            auVar264 = vminps_avx(auVar264,auVar147);
            auVar148._8_4_ = 0xc2b0c0a5;
            auVar148._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar148._12_4_ = 0xc2b0c0a5;
            auVar148._16_4_ = 0xc2b0c0a5;
            auVar148._20_4_ = 0xc2b0c0a5;
            auVar148._24_4_ = 0xc2b0c0a5;
            auVar148._28_4_ = 0xc2b0c0a5;
            auVar209 = vmaxps_avx(auVar264,auVar148);
            auVar149._0_4_ = auVar209._0_4_ * 1.442695 + 0.5;
            auVar149._4_4_ = auVar209._4_4_ * 1.442695 + 0.5;
            auVar149._8_4_ = auVar209._8_4_ * 1.442695 + 0.5;
            auVar149._12_4_ = auVar209._12_4_ * 1.442695 + 0.5;
            auVar149._16_4_ = auVar209._16_4_ * 1.442695 + 0.5;
            auVar149._20_4_ = auVar209._20_4_ * 1.442695 + 0.5;
            auVar149._24_4_ = auVar209._24_4_ * 1.442695 + 0.5;
            auVar149._28_4_ = 0x3ff8aa3b;
            auVar205 = vroundps_avx(auVar149,1);
            auVar264 = vcmpps_avx(auVar149,auVar205,1);
            auVar264 = vandps_avx(auVar264,auVar56);
            auVar264 = vsubps_avx(auVar205,auVar264);
            auVar18._4_4_ = auVar264._4_4_ * 0.6931472;
            auVar18._0_4_ = auVar264._0_4_ * 0.6931472;
            auVar18._8_4_ = auVar264._8_4_ * 0.6931472;
            auVar18._12_4_ = auVar264._12_4_ * 0.6931472;
            auVar18._16_4_ = auVar264._16_4_ * 0.6931472;
            auVar18._20_4_ = auVar264._20_4_ * 0.6931472;
            auVar18._24_4_ = auVar264._24_4_ * 0.6931472;
            auVar18._28_4_ = auVar205._28_4_;
            auVar209 = vsubps_avx(auVar209,auVar18);
            fVar207 = auVar209._0_4_;
            fVar210 = auVar209._4_4_;
            fVar213 = auVar209._8_4_;
            fVar214 = auVar209._12_4_;
            fVar215 = auVar209._16_4_;
            fVar216 = auVar209._20_4_;
            fVar104 = auVar209._24_4_;
            auVar206 = ZEXT3264(auVar56);
            auVar266 = ZEXT864(0) << 0x20;
            auVar113._0_4_ = (int)auVar264._0_4_;
            auVar113._4_4_ = (int)auVar264._4_4_;
            auVar113._8_4_ = (int)auVar264._8_4_;
            auVar113._12_4_ = (int)auVar264._12_4_;
            auVar150._16_4_ = (int)auVar264._16_4_;
            auVar150._0_16_ = auVar113;
            auVar150._20_4_ = (int)auVar264._20_4_;
            auVar150._24_4_ = (int)auVar264._24_4_;
            auVar150._28_4_ = (int)auVar264._28_4_;
            auVar164 = vpslld_avx(auVar113,0x17);
            auVar112 = vpslld_avx(auVar150._16_16_,0x17);
            auVar112 = vpaddd_avx(auVar245,auVar112);
            auVar164 = vpaddd_avx(auVar245,auVar164);
            auVar49._0_4_ =
                 (fVar207 + fVar211 +
                 fVar207 * fVar207 *
                 (((((fVar207 * 0.00019875691 + 0.0013981999) * fVar207 + 0.008333452) * fVar207 +
                   0.041665796) * fVar207 + 0.16666666) * fVar207 + 0.5)) * auVar164._0_4_ + fVar211
            ;
            auVar49._4_4_ =
                 (fVar210 + fVar212 +
                 fVar210 * fVar210 *
                 (((((fVar210 * 0.00019875691 + 0.0013981999) * fVar210 + 0.008333452) * fVar210 +
                   0.041665796) * fVar210 + 0.16666666) * fVar210 + 0.5)) * auVar164._4_4_ + fVar212
            ;
            auVar49._8_4_ =
                 (fVar213 + fVar258 +
                 fVar213 * fVar213 *
                 (((((fVar213 * 0.00019875691 + 0.0013981999) * fVar213 + 0.008333452) * fVar213 +
                   0.041665796) * fVar213 + 0.16666666) * fVar213 + 0.5)) * auVar164._8_4_ + fVar258
            ;
            auVar49._12_4_ =
                 (fVar214 + fVar259 +
                 fVar214 * fVar214 *
                 (((((fVar214 * 0.00019875691 + 0.0013981999) * fVar214 + 0.008333452) * fVar214 +
                   0.041665796) * fVar214 + 0.16666666) * fVar214 + 0.5)) * auVar164._12_4_ +
                 fVar259;
            auVar49._16_4_ =
                 (fVar215 + fVar260 +
                 fVar215 * fVar215 *
                 (((((fVar215 * 0.00019875691 + 0.0013981999) * fVar215 + 0.008333452) * fVar215 +
                   0.041665796) * fVar215 + 0.16666666) * fVar215 + 0.5)) * auVar112._0_4_ + fVar260
            ;
            auVar49._20_4_ =
                 (fVar216 + fVar261 +
                 fVar216 * fVar216 *
                 (((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) * fVar216 +
                   0.041665796) * fVar216 + 0.16666666) * fVar216 + 0.5)) * auVar112._4_4_ + fVar261
            ;
            auVar49._24_4_ =
                 (fVar104 + fVar262 +
                 fVar104 * fVar104 *
                 (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) * fVar104 +
                   0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5)) * auVar112._8_4_ + fVar262
            ;
            auVar49._28_4_ = auVar209._28_4_ + fVar263 + auVar205._28_4_ + fVar263;
            auVar56 = vrcpps_avx(auVar49);
            fVar211 = auVar56._0_4_;
            fVar258 = auVar56._4_4_;
            fVar259 = auVar56._8_4_;
            fVar260 = auVar56._12_4_;
            fVar261 = auVar56._16_4_;
            fVar262 = auVar56._20_4_;
            fVar263 = auVar56._24_4_;
            auVar19._4_4_ = auVar49._4_4_ * (fVar258 + fVar258);
            auVar19._0_4_ = auVar49._0_4_ * (fVar211 + fVar211);
            auVar19._8_4_ = auVar49._8_4_ * (fVar259 + fVar259);
            auVar19._12_4_ = auVar49._12_4_ * (fVar260 + fVar260);
            auVar19._16_4_ = auVar49._16_4_ * (fVar261 + fVar261);
            auVar19._20_4_ = auVar49._20_4_ * (fVar262 + fVar262);
            auVar19._24_4_ = auVar49._24_4_ * (fVar263 + fVar263);
            auVar19._28_4_ = auVar49._28_4_;
            auVar199._8_4_ = 0x40000000;
            auVar199._0_8_ = 0x4000000040000000;
            auVar199._12_4_ = 0x40000000;
            auVar199._16_4_ = 0x40000000;
            auVar199._20_4_ = 0x40000000;
            auVar199._24_4_ = 0x40000000;
            auVar199._28_4_ = 0x40000000;
            auVar264 = vsubps_avx(auVar199,auVar19);
            fVar212 = auVar56._28_4_ + auVar56._28_4_ + -1.0;
            auVar46._0_4_ = fVar211 + fVar211 + -1.0 + fVar211 * auVar264._0_4_;
            auVar46._4_4_ = fVar258 + fVar258 + -1.0 + fVar258 * auVar264._4_4_;
            auVar46._8_4_ = fVar259 + fVar259 + -1.0 + fVar259 * auVar264._8_4_;
            auVar46._12_4_ = fVar260 + fVar260 + -1.0 + fVar260 * auVar264._12_4_;
            auVar46._16_4_ = fVar261 + fVar261 + -1.0 + fVar261 * auVar264._16_4_;
            auVar46._20_4_ = fVar262 + fVar262 + -1.0 + fVar262 * auVar264._20_4_;
            auVar46._24_4_ = fVar263 + fVar263 + -1.0 + fVar263 * auVar264._24_4_;
            goto LAB_002c1ea9;
          case 6:
            fVar211 = **(float **)(&this->field_0xe8 + (long)p_Var9);
            fVar212 = (*(float **)(&this->field_0xe8 + (long)p_Var9))[1];
            auVar53._0_4_ = fVar211 * fVar254 + fVar212;
            auVar53._4_4_ = fVar211 * fVar257 + fVar212;
            auVar53._8_4_ = fVar211 * auVar84._8_4_ + fVar212;
            auVar53._12_4_ = fVar211 * auVar84._12_4_ + fVar212;
            auVar53._16_4_ = fVar211 * auVar84._16_4_ + fVar212;
            auVar53._20_4_ = fVar211 * auVar84._20_4_ + fVar212;
            auVar53._24_4_ = fVar211 * auVar84._24_4_ + fVar212;
            auVar53._28_4_ = fVar211 + fVar212;
            auVar264 = vmaxps_avx(auVar264,auVar53);
            auVar56 = vminps_avx(auVar264,auVar56);
            auVar46 = auVar56._0_28_;
LAB_002c1ea9:
            auVar152._4_4_ = auVar46._4_4_ * fVar257;
            auVar152._0_4_ = auVar46._0_4_ * fVar254;
            auVar152._8_4_ = auVar46._8_4_ * auVar84._8_4_;
            auVar152._12_4_ = auVar46._12_4_ * auVar84._12_4_;
            auVar152._16_4_ = auVar46._16_4_ * auVar84._16_4_;
            auVar152._20_4_ = auVar46._20_4_ * auVar84._20_4_;
            auVar152._24_4_ = auVar46._24_4_ * auVar84._24_4_;
            auVar152._28_4_ = fVar212;
          }
switchD_002c19f6_caseD_1:
          *(undefined1 (*) [32])((long)top_blob->data + uVar28 * 0x20) = auVar152;
        }
      }
    }
  }
  if (piStack_e0 != (int *)0x0) {
    LOCK();
    *piStack_e0 = *piStack_e0 + -1;
    UNLOCK();
    if (*piStack_e0 == 0) {
      if (local_c8 == (Allocator *)0x0) {
        free(local_e8);
      }
      else {
        (*local_c8->_vptr_Allocator[3])();
      }
    }
  }
  return local_148;
}

Assistant:

int InnerProduct_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}